

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx::SubGridMBIntersectorKPluecker<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  int iVar53;
  AABBNodeMB4D *node1;
  ulong uVar54;
  long lVar55;
  ulong uVar56;
  uint uVar57;
  ulong uVar58;
  long lVar59;
  undefined4 uVar60;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  long lVar65;
  ulong uVar66;
  ulong uVar67;
  size_t sVar68;
  long lVar69;
  ulong *puVar70;
  ulong uVar71;
  RayK<8> *pRVar72;
  long lVar73;
  bool bVar74;
  float fVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar79 [16];
  float fVar87;
  float fVar89;
  float fVar94;
  float fVar97;
  float fVar100;
  undefined1 auVar80 [32];
  undefined1 auVar78 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  float fVar91;
  float fVar92;
  float fVar95;
  float fVar98;
  float fVar101;
  undefined1 auVar84 [32];
  float fVar88;
  float fVar90;
  float fVar93;
  float fVar96;
  float fVar99;
  float fVar102;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  float fVar103;
  float fVar112;
  float fVar113;
  vint4 ai_5;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar114;
  float fVar115;
  float fVar116;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  vint4 ai;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar134;
  float fVar138;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 bi;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 ai_1;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [32];
  float fVar163;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  vint4 bi_1;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [64];
  float fVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  undefined1 auVar187 [64];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [64];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  float fVar207;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  float fVar217;
  undefined1 auVar213 [32];
  float fVar215;
  float fVar216;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar214 [64];
  undefined1 auVar221 [32];
  undefined1 auVar222 [64];
  float fVar223;
  undefined1 auVar224 [32];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar225 [64];
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar235 [32];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar254;
  undefined1 auVar236 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  float fVar257;
  float fVar258;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar259 [64];
  float fVar272;
  float fVar273;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar274 [64];
  vint4 bi_5;
  vint4 bi_2;
  RTCFilterFunctionNArguments args;
  vint<8> itime;
  vfloat<8> ftime;
  PlueckerHitM<8,_embree::avx::UVIdentity<8>_> hit;
  NodeRef stack [244];
  undefined1 local_eb1;
  ulong local_eb0;
  ulong local_ea8;
  ulong local_ea0;
  ulong local_e98;
  ulong local_e90;
  ulong local_e88;
  ulong local_e80;
  ulong *local_e78;
  ulong local_e70;
  uint local_e68;
  uint local_e64;
  undefined8 local_e60;
  float fStack_e58;
  float fStack_e54;
  float fStack_e50;
  float fStack_e4c;
  float fStack_e48;
  float fStack_e44;
  undefined1 local_e40 [16];
  undefined1 local_e30 [16];
  undefined1 local_e20 [16];
  undefined1 local_e10 [16];
  undefined1 local_e00 [16];
  undefined1 local_df0 [16];
  undefined1 local_de0 [16];
  undefined1 local_dd0 [16];
  undefined1 local_dc0 [16];
  undefined1 local_db0 [16];
  undefined1 local_da0 [16];
  ulong local_d90;
  size_t local_d88;
  ulong local_d80;
  undefined1 auStack_d78 [24];
  Geometry *local_d60;
  undefined1 auStack_d58 [24];
  undefined8 *local_d30;
  undefined1 (*local_d28) [16];
  ulong local_d20;
  long local_d18;
  RayK<8> *local_d10;
  ulong local_d08;
  long local_d00;
  long local_cf8;
  Scene *local_cf0;
  ulong *local_ce8;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  RTCFilterFunctionNArguments local_c30;
  undefined1 local_c00 [16];
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [32];
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  float fStack_b90;
  float fStack_b8c;
  float fStack_b88;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  float local_b20;
  float fStack_b1c;
  float fStack_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 *local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  float local_980 [4];
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  float local_960 [4];
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined4 uStack_944;
  float local_940 [4];
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  undefined4 uStack_924;
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_800 = root.ptr;
  uVar60 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_dc0._4_4_ = uVar60;
  local_dc0._0_4_ = uVar60;
  local_dc0._8_4_ = uVar60;
  local_dc0._12_4_ = uVar60;
  auVar236 = ZEXT1664(local_dc0);
  uVar60 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_dd0._4_4_ = uVar60;
  local_dd0._0_4_ = uVar60;
  local_dd0._8_4_ = uVar60;
  local_dd0._12_4_ = uVar60;
  auVar256 = ZEXT1664(local_dd0);
  uVar60 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_de0._4_4_ = uVar60;
  local_de0._0_4_ = uVar60;
  local_de0._8_4_ = uVar60;
  local_de0._12_4_ = uVar60;
  auVar259 = ZEXT1664(local_de0);
  fVar75 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar88 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  auVar78 = ZEXT416((uint)(fVar75 * 0.99999964));
  local_df0 = vshufps_avx(auVar78,auVar78,0);
  auVar274 = ZEXT1664(local_df0);
  auVar78 = ZEXT416((uint)(fVar88 * 0.99999964));
  local_e00 = vshufps_avx(auVar78,auVar78,0);
  auVar214 = ZEXT1664(local_e00);
  auVar78 = ZEXT416((uint)(fVar90 * 0.99999964));
  local_e10 = vshufps_avx(auVar78,auVar78,0);
  auVar187 = ZEXT1664(local_e10);
  auVar78 = ZEXT416((uint)(fVar75 * 1.0000004));
  local_e20 = vshufps_avx(auVar78,auVar78,0);
  auVar222 = ZEXT1664(local_e20);
  auVar78 = ZEXT416((uint)(fVar88 * 1.0000004));
  local_e30 = vshufps_avx(auVar78,auVar78,0);
  auVar225 = ZEXT1664(local_e30);
  auVar78 = ZEXT416((uint)(fVar90 * 1.0000004));
  local_e40 = vshufps_avx(auVar78,auVar78,0);
  auVar201 = ZEXT1664(local_e40);
  uVar62 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar63 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar64 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar66 = uVar62 ^ 0x10;
  uVar67 = uVar63 ^ 0x10;
  iVar53 = (tray->tnear).field_0.i[k];
  local_da0._4_4_ = iVar53;
  local_da0._0_4_ = iVar53;
  local_da0._8_4_ = iVar53;
  local_da0._12_4_ = iVar53;
  auVar176 = ZEXT1664(local_da0);
  iVar53 = (tray->tfar).field_0.i[k];
  local_db0._4_4_ = iVar53;
  local_db0._0_4_ = iVar53;
  local_db0._8_4_ = iVar53;
  local_db0._12_4_ = iVar53;
  auVar206 = ZEXT1664(local_db0);
  uVar57 = 1 << ((byte)k & 0x1f);
  local_b80._16_16_ = mm_lookupmask_ps._240_16_;
  local_b80._0_16_ = mm_lookupmask_ps._0_16_;
  local_d28 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar57 & 0xf) << 4));
  local_d30 = (undefined8 *)(mm_lookupmask_ps + (long)((int)uVar57 >> 4) * 0x10);
  uVar58 = uVar64 ^ 0x10;
  auVar127._8_4_ = 0x3f800000;
  auVar127._0_8_ = &DAT_3f8000003f800000;
  auVar127._12_4_ = 0x3f800000;
  auVar127._16_4_ = 0x3f800000;
  auVar127._20_4_ = 0x3f800000;
  auVar127._24_4_ = 0x3f800000;
  auVar127._28_4_ = 0x3f800000;
  auVar80._8_4_ = 0xbf800000;
  auVar80._0_8_ = 0xbf800000bf800000;
  auVar80._12_4_ = 0xbf800000;
  auVar80._16_4_ = 0xbf800000;
  auVar80._20_4_ = 0xbf800000;
  auVar80._24_4_ = 0xbf800000;
  auVar80._28_4_ = 0xbf800000;
  _local_ba0 = vblendvps_avx(auVar127,auVar80,local_b80);
  puVar70 = local_7f8;
  local_eb0 = uVar58;
  local_ea0 = uVar67;
  local_e98 = uVar66;
  local_e90 = uVar64;
  local_e88 = uVar63;
  local_e80 = uVar62;
  local_d88 = k;
  local_d10 = ray;
  do {
    local_ce8 = puVar70;
    if (local_ce8 == &local_800) break;
    puVar70 = local_ce8 + -1;
    uVar71 = local_ce8[-1];
    do {
      if ((uVar71 & 8) == 0) {
        uVar54 = uVar71 & 0xfffffffffffffff0;
        fVar75 = *(float *)(ray + k * 4 + 0xe0);
        auVar77._4_4_ = fVar75;
        auVar77._0_4_ = fVar75;
        auVar77._8_4_ = fVar75;
        auVar77._12_4_ = fVar75;
        pfVar2 = (float *)(uVar54 + 0x80 + uVar62);
        pfVar1 = (float *)(uVar54 + 0x20 + uVar62);
        auVar78._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar78._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar78._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar78._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar78 = vsubps_avx(auVar78,auVar236._0_16_);
        pfVar2 = (float *)(uVar54 + 0x80 + uVar63);
        pfVar1 = (float *)(uVar54 + 0x20 + uVar63);
        auVar117._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar117._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar117._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar117._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar104._0_4_ = auVar274._0_4_ * auVar78._0_4_;
        auVar104._4_4_ = auVar274._4_4_ * auVar78._4_4_;
        auVar104._8_4_ = auVar274._8_4_ * auVar78._8_4_;
        auVar104._12_4_ = auVar274._12_4_ * auVar78._12_4_;
        auVar78 = vsubps_avx(auVar117,auVar256._0_16_);
        pfVar2 = (float *)(uVar54 + 0x80 + uVar64);
        auVar118._0_4_ = auVar214._0_4_ * auVar78._0_4_;
        auVar118._4_4_ = auVar214._4_4_ * auVar78._4_4_;
        auVar118._8_4_ = auVar214._8_4_ * auVar78._8_4_;
        auVar118._12_4_ = auVar214._12_4_ * auVar78._12_4_;
        pfVar1 = (float *)(uVar54 + 0x20 + uVar64);
        auVar139._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar139._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar139._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar139._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar78 = vsubps_avx(auVar139,auVar259._0_16_);
        auVar140._0_4_ = auVar187._0_4_ * auVar78._0_4_;
        auVar140._4_4_ = auVar187._4_4_ * auVar78._4_4_;
        auVar140._8_4_ = auVar187._8_4_ * auVar78._8_4_;
        auVar140._12_4_ = auVar187._12_4_ * auVar78._12_4_;
        auVar78 = vmaxps_avx(auVar118,auVar140);
        auVar104 = vmaxps_avx(auVar176._0_16_,auVar104);
        auVar78 = vmaxps_avx(auVar104,auVar78);
        pfVar2 = (float *)(uVar54 + 0x80 + uVar66);
        pfVar1 = (float *)(uVar54 + 0x20 + uVar66);
        auVar119._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar119._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar119._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar119._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar104 = vsubps_avx(auVar119,auVar236._0_16_);
        auVar120._0_4_ = auVar222._0_4_ * auVar104._0_4_;
        auVar120._4_4_ = auVar222._4_4_ * auVar104._4_4_;
        auVar120._8_4_ = auVar222._8_4_ * auVar104._8_4_;
        auVar120._12_4_ = auVar222._12_4_ * auVar104._12_4_;
        pfVar2 = (float *)(uVar54 + 0x80 + uVar67);
        pfVar1 = (float *)(uVar54 + 0x20 + uVar67);
        auVar141._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar141._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar141._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar141._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar104 = vsubps_avx(auVar141,auVar256._0_16_);
        auVar142._0_4_ = auVar225._0_4_ * auVar104._0_4_;
        auVar142._4_4_ = auVar225._4_4_ * auVar104._4_4_;
        auVar142._8_4_ = auVar225._8_4_ * auVar104._8_4_;
        auVar142._12_4_ = auVar225._12_4_ * auVar104._12_4_;
        pfVar2 = (float *)(uVar54 + 0x80 + uVar58);
        pfVar1 = (float *)(uVar54 + 0x20 + uVar58);
        auVar150._0_4_ = fVar75 * *pfVar2 + *pfVar1;
        auVar150._4_4_ = fVar75 * pfVar2[1] + pfVar1[1];
        auVar150._8_4_ = fVar75 * pfVar2[2] + pfVar1[2];
        auVar150._12_4_ = fVar75 * pfVar2[3] + pfVar1[3];
        auVar104 = vsubps_avx(auVar150,auVar259._0_16_);
        auVar151._0_4_ = auVar201._0_4_ * auVar104._0_4_;
        auVar151._4_4_ = auVar201._4_4_ * auVar104._4_4_;
        auVar151._8_4_ = auVar201._8_4_ * auVar104._8_4_;
        auVar151._12_4_ = auVar201._12_4_ * auVar104._12_4_;
        auVar104 = vminps_avx(auVar142,auVar151);
        auVar117 = vminps_avx(auVar206._0_16_,auVar120);
        auVar104 = vminps_avx(auVar117,auVar104);
        if (((uint)uVar71 & 7) == 6) {
          auVar104 = vcmpps_avx(auVar78,auVar104,2);
          auVar78 = vcmpps_avx(*(undefined1 (*) [16])(uVar54 + 0xe0),auVar77,2);
          auVar117 = vcmpps_avx(auVar77,*(undefined1 (*) [16])(uVar54 + 0xf0),1);
          auVar78 = vandps_avx(auVar78,auVar117);
          auVar78 = vandps_avx(auVar78,auVar104);
        }
        else {
          auVar78 = vcmpps_avx(auVar78,auVar104,2);
        }
        auVar78 = vpslld_avx(auVar78,0x1f);
        uVar60 = vmovmskps_avx(auVar78);
        unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar60);
      }
      if ((uVar71 & 8) == 0) {
        if (unaff_RBX == 0) {
          uVar57 = 4;
        }
        else {
          uVar54 = uVar71 & 0xfffffffffffffff0;
          lVar59 = 0;
          if (unaff_RBX != 0) {
            for (; (unaff_RBX >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
            }
          }
          uVar57 = 0;
          uVar71 = *(ulong *)(uVar54 + lVar59 * 8);
          uVar61 = unaff_RBX - 1 & unaff_RBX;
          if (uVar61 != 0) {
            *puVar70 = uVar71;
            lVar59 = 0;
            if (uVar61 != 0) {
              for (; (uVar61 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
              }
            }
            uVar56 = uVar61 - 1;
            while( true ) {
              puVar70 = puVar70 + 1;
              uVar71 = *(ulong *)(uVar54 + lVar59 * 8);
              uVar56 = uVar56 & uVar61;
              uVar58 = local_eb0;
              if (uVar56 == 0) break;
              *puVar70 = uVar71;
              lVar59 = 0;
              if (uVar56 != 0) {
                for (; (uVar56 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar61 = uVar56 - 1;
            }
          }
        }
      }
      else {
        uVar57 = 6;
      }
    } while (uVar57 == 0);
    if (uVar57 == 6) {
      local_ea8 = (ulong)((uint)uVar71 & 0xf) - 8;
      bVar74 = local_ea8 != 0;
      if (bVar74) {
        uVar71 = uVar71 & 0xfffffffffffffff0;
        local_d08 = 0;
        local_e78 = puVar70;
        do {
          local_d18 = local_d08 * 0x90;
          uVar54 = *(ulong *)(uVar71 + 0x20 + local_d18);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = uVar54;
          auVar143._8_8_ = 0;
          auVar143._0_8_ = *(ulong *)(uVar71 + 0x24 + local_d18);
          auVar78 = vpminub_avx(auVar121,auVar143);
          auVar104 = vpcmpeqb_avx(auVar121,auVar78);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = uVar54;
          auVar78 = vpmovzxbd_avx(auVar122);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar75 = *(float *)(uVar71 + 0x44 + local_d18);
          fVar88 = *(float *)(uVar71 + 0x38 + local_d18);
          auVar123._0_4_ = fVar75 * auVar78._0_4_ + fVar88;
          auVar123._4_4_ = fVar75 * auVar78._4_4_ + fVar88;
          auVar123._8_4_ = fVar75 * auVar78._8_4_ + fVar88;
          auVar123._12_4_ = fVar75 * auVar78._12_4_ + fVar88;
          auVar178._8_8_ = 0;
          auVar178._0_8_ = *(ulong *)(uVar71 + 0x50 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar178);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar90 = *(float *)(uVar71 + 0x74 + local_d18);
          fVar93 = *(float *)(uVar71 + 0x68 + local_d18);
          auVar179._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar179._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar179._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar179._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar78 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) -
                                   *(float *)(uVar71 + 0x80 + local_d18)) *
                                  *(float *)(uVar71 + 0x84 + local_d18)));
          auVar78 = vshufps_avx(auVar78,auVar78,0);
          auVar117 = vsubps_avx(auVar179,auVar123);
          fVar96 = auVar78._0_4_;
          fVar99 = auVar78._4_4_;
          fVar102 = auVar78._8_4_;
          fVar134 = auVar78._12_4_;
          auVar124._0_4_ = auVar123._0_4_ + fVar96 * auVar117._0_4_;
          auVar124._4_4_ = auVar123._4_4_ + fVar99 * auVar117._4_4_;
          auVar124._8_4_ = auVar123._8_4_ + fVar102 * auVar117._8_4_;
          auVar124._12_4_ = auVar123._12_4_ + fVar134 * auVar117._12_4_;
          auVar78 = vpmovzxbd_avx(auVar143);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar144._0_4_ = fVar88 + fVar75 * auVar78._0_4_;
          auVar144._4_4_ = fVar88 + fVar75 * auVar78._4_4_;
          auVar144._8_4_ = fVar88 + fVar75 * auVar78._8_4_;
          auVar144._12_4_ = fVar88 + fVar75 * auVar78._12_4_;
          auVar152._8_8_ = 0;
          auVar152._0_8_ = *(ulong *)(uVar71 + 0x54 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar152);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar153._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar153._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar153._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar153._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar153,auVar144);
          auVar145._0_4_ = auVar144._0_4_ + fVar96 * auVar78._0_4_;
          auVar145._4_4_ = auVar144._4_4_ + fVar99 * auVar78._4_4_;
          auVar145._8_4_ = auVar144._8_4_ + fVar102 * auVar78._8_4_;
          auVar145._12_4_ = auVar144._12_4_ + fVar134 * auVar78._12_4_;
          auVar154._8_8_ = 0;
          auVar154._0_8_ = *(ulong *)(uVar71 + 0x28 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar154);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar75 = *(float *)(uVar71 + 0x48 + local_d18);
          fVar88 = *(float *)(uVar71 + 0x3c + local_d18);
          auVar155._0_4_ = fVar88 + fVar75 * auVar78._0_4_;
          auVar155._4_4_ = fVar88 + fVar75 * auVar78._4_4_;
          auVar155._8_4_ = fVar88 + fVar75 * auVar78._8_4_;
          auVar155._12_4_ = fVar88 + fVar75 * auVar78._12_4_;
          auVar194._8_8_ = 0;
          auVar194._0_8_ = *(ulong *)(uVar71 + 0x58 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar194);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar90 = *(float *)(uVar71 + 0x78 + local_d18);
          fVar93 = *(float *)(uVar71 + 0x6c + local_d18);
          auVar195._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar195._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar195._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar195._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar195,auVar155);
          auVar156._0_4_ = auVar155._0_4_ + fVar96 * auVar78._0_4_;
          auVar156._4_4_ = auVar155._4_4_ + fVar99 * auVar78._4_4_;
          auVar156._8_4_ = auVar155._8_4_ + fVar102 * auVar78._8_4_;
          auVar156._12_4_ = auVar155._12_4_ + fVar134 * auVar78._12_4_;
          auVar196._8_8_ = 0;
          auVar196._0_8_ = *(ulong *)(uVar71 + 0x2c + local_d18);
          auVar78 = vpmovzxbd_avx(auVar196);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar167._0_4_ = fVar88 + fVar75 * auVar78._0_4_;
          auVar167._4_4_ = fVar88 + fVar75 * auVar78._4_4_;
          auVar167._8_4_ = fVar88 + fVar75 * auVar78._8_4_;
          auVar167._12_4_ = fVar88 + fVar75 * auVar78._12_4_;
          auVar180._8_8_ = 0;
          auVar180._0_8_ = *(ulong *)(uVar71 + 0x5c + local_d18);
          auVar78 = vpmovzxbd_avx(auVar180);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar181._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar181._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar181._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar181._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar181,auVar167);
          auVar168._0_4_ = auVar167._0_4_ + fVar96 * auVar78._0_4_;
          auVar168._4_4_ = auVar167._4_4_ + fVar99 * auVar78._4_4_;
          auVar168._8_4_ = auVar167._8_4_ + fVar102 * auVar78._8_4_;
          auVar168._12_4_ = auVar167._12_4_ + fVar134 * auVar78._12_4_;
          auVar182._8_8_ = 0;
          auVar182._0_8_ = *(ulong *)(uVar71 + 0x30 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar182);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar75 = *(float *)(uVar71 + 0x4c + local_d18);
          fVar88 = *(float *)(uVar71 + 0x40 + local_d18);
          auVar183._0_4_ = fVar88 + fVar75 * auVar78._0_4_;
          auVar183._4_4_ = fVar88 + fVar75 * auVar78._4_4_;
          auVar183._8_4_ = fVar88 + fVar75 * auVar78._8_4_;
          auVar183._12_4_ = fVar88 + fVar75 * auVar78._12_4_;
          auVar208._8_8_ = 0;
          auVar208._0_8_ = *(ulong *)(uVar71 + 0x60 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar208);
          auVar78 = vcvtdq2ps_avx(auVar78);
          fVar90 = *(float *)(uVar71 + 0x7c + local_d18);
          fVar93 = *(float *)(uVar71 + 0x70 + local_d18);
          auVar209._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar209._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar209._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar209._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar209,auVar183);
          auVar184._0_4_ = auVar78._0_4_ * fVar96 + auVar183._0_4_;
          auVar184._4_4_ = auVar78._4_4_ * fVar99 + auVar183._4_4_;
          auVar184._8_4_ = auVar78._8_4_ * fVar102 + auVar183._8_4_;
          auVar184._12_4_ = auVar78._12_4_ * fVar134 + auVar183._12_4_;
          auVar210._8_8_ = 0;
          auVar210._0_8_ = *(ulong *)(uVar71 + 0x34 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar210);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar197._0_4_ = fVar88 + auVar78._0_4_ * fVar75;
          auVar197._4_4_ = fVar88 + auVar78._4_4_ * fVar75;
          auVar197._8_4_ = fVar88 + auVar78._8_4_ * fVar75;
          auVar197._12_4_ = fVar88 + auVar78._12_4_ * fVar75;
          auVar202._8_8_ = 0;
          auVar202._0_8_ = *(ulong *)(uVar71 + 100 + local_d18);
          auVar78 = vpmovzxbd_avx(auVar202);
          auVar78 = vcvtdq2ps_avx(auVar78);
          auVar222 = ZEXT1664(local_e20);
          auVar214 = ZEXT1664(local_e00);
          auVar203._0_4_ = fVar93 + fVar90 * auVar78._0_4_;
          auVar203._4_4_ = fVar93 + fVar90 * auVar78._4_4_;
          auVar203._8_4_ = fVar93 + fVar90 * auVar78._8_4_;
          auVar203._12_4_ = fVar93 + fVar90 * auVar78._12_4_;
          auVar225 = ZEXT1664(local_e30);
          auVar78 = vsubps_avx(auVar203,auVar197);
          auVar206 = ZEXT1664(local_db0);
          auVar105._0_4_ = auVar197._0_4_ + auVar78._0_4_ * fVar96;
          auVar105._4_4_ = auVar197._4_4_ + auVar78._4_4_ * fVar99;
          auVar105._8_4_ = auVar197._8_4_ + auVar78._8_4_ * fVar102;
          auVar105._12_4_ = auVar197._12_4_ + auVar78._12_4_ * fVar134;
          auVar78 = vsubps_avx(auVar124,auVar236._0_16_);
          auVar125._0_4_ = auVar274._0_4_ * auVar78._0_4_;
          auVar125._4_4_ = auVar274._4_4_ * auVar78._4_4_;
          auVar125._8_4_ = auVar274._8_4_ * auVar78._8_4_;
          auVar125._12_4_ = auVar274._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar156,auVar256._0_16_);
          auVar157._0_4_ = local_e00._0_4_ * auVar78._0_4_;
          auVar157._4_4_ = local_e00._4_4_ * auVar78._4_4_;
          auVar157._8_4_ = local_e00._8_4_ * auVar78._8_4_;
          auVar157._12_4_ = local_e00._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar145,auVar236._0_16_);
          auVar146._0_4_ = local_e20._0_4_ * auVar78._0_4_;
          auVar146._4_4_ = local_e20._4_4_ * auVar78._4_4_;
          auVar146._8_4_ = local_e20._8_4_ * auVar78._8_4_;
          auVar146._12_4_ = local_e20._12_4_ * auVar78._12_4_;
          auVar78 = vsubps_avx(auVar168,auVar256._0_16_);
          auVar169._0_4_ = local_e30._0_4_ * auVar78._0_4_;
          auVar169._4_4_ = local_e30._4_4_ * auVar78._4_4_;
          auVar169._8_4_ = local_e30._8_4_ * auVar78._8_4_;
          auVar169._12_4_ = local_e30._12_4_ * auVar78._12_4_;
          auVar117 = vpminsd_avx(auVar125,auVar146);
          auVar78 = vpmaxsd_avx(auVar125,auVar146);
          auVar77 = vpminsd_avx(auVar157,auVar169);
          auVar117 = vpmaxsd_avx(auVar117,auVar77);
          auVar201 = ZEXT1664(local_e40);
          auVar77 = vpmaxsd_avx(auVar157,auVar169);
          auVar118 = vsubps_avx(auVar184,auVar259._0_16_);
          auVar187 = ZEXT1664(local_e10);
          auVar170._0_4_ = local_e10._0_4_ * auVar118._0_4_;
          auVar170._4_4_ = local_e10._4_4_ * auVar118._4_4_;
          auVar170._8_4_ = local_e10._8_4_ * auVar118._8_4_;
          auVar170._12_4_ = local_e10._12_4_ * auVar118._12_4_;
          auVar118 = vsubps_avx(auVar105,auVar259._0_16_);
          auVar106._0_4_ = local_e40._0_4_ * auVar118._0_4_;
          auVar106._4_4_ = local_e40._4_4_ * auVar118._4_4_;
          auVar106._8_4_ = local_e40._8_4_ * auVar118._8_4_;
          auVar106._12_4_ = local_e40._12_4_ * auVar118._12_4_;
          auVar118 = vpminsd_avx(auVar78,auVar77);
          auVar77 = vpminsd_avx(auVar170,auVar106);
          auVar78 = vpmaxsd_avx(auVar170,auVar106);
          auVar176 = ZEXT1664(local_da0);
          auVar77 = vpmaxsd_avx(auVar77,local_da0);
          auVar117 = vpmaxsd_avx(auVar117,auVar77);
          auVar78 = vpminsd_avx(auVar78,local_db0);
          auVar78 = vpminsd_avx(auVar118,auVar78);
          auVar78 = vpcmpgtd_avx(auVar117,auVar78);
          auVar104 = vpmovsxbd_avx(auVar104);
          auVar78 = vpandn_avx(auVar78,auVar104);
          uVar57 = vmovmskps_avx(auVar78);
          if (uVar57 != 0) {
            local_d18 = local_d18 + uVar71;
            local_e70 = (ulong)(uVar57 & 0xff);
            sVar68 = k;
            pRVar72 = ray;
            do {
              ray = local_d10;
              k = local_d88;
              lVar59 = 0;
              if (local_e70 != 0) {
                for (; (local_e70 >> lVar59 & 1) == 0; lVar59 = lVar59 + 1) {
                }
              }
              uVar3 = *(ushort *)(local_d18 + lVar59 * 8);
              uVar4 = *(ushort *)(local_d18 + 2 + lVar59 * 8);
              uVar57 = *(uint *)(local_d18 + 0x88);
              local_d90 = (ulong)uVar57;
              uVar5 = *(uint *)(local_d18 + 4 + lVar59 * 8);
              local_d20 = (ulong)uVar5;
              local_cf0 = context->scene;
              pGVar7 = (local_cf0->geometries).items[local_d90].ptr;
              local_cf8 = *(long *)&pGVar7->field_0x58;
              fVar75 = (pGVar7->time_range).lower;
              auVar81._4_4_ = fVar75;
              auVar81._0_4_ = fVar75;
              auVar81._8_4_ = fVar75;
              auVar81._12_4_ = fVar75;
              auVar81._16_4_ = fVar75;
              auVar81._20_4_ = fVar75;
              auVar81._24_4_ = fVar75;
              auVar81._28_4_ = fVar75;
              fVar88 = pGVar7->fnumTimeSegments;
              auVar80 = vsubps_avx(*(undefined1 (*) [32])(pRVar72 + 0xe0),auVar81);
              auVar78 = ZEXT416((uint)((pGVar7->time_range).upper - fVar75));
              auVar78 = vshufps_avx(auVar78,auVar78,0);
              auVar82._16_16_ = auVar78;
              auVar82._0_16_ = auVar78;
              auVar80 = vdivps_avx(auVar80,auVar82);
              local_d00 = pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                          _M_i * local_d20;
              auVar13._4_4_ = fVar88 * auVar80._4_4_;
              auVar13._0_4_ = fVar88 * auVar80._0_4_;
              auVar13._8_4_ = fVar88 * auVar80._8_4_;
              auVar13._12_4_ = fVar88 * auVar80._12_4_;
              auVar13._16_4_ = fVar88 * auVar80._16_4_;
              auVar13._20_4_ = fVar88 * auVar80._20_4_;
              auVar13._24_4_ = fVar88 * auVar80._24_4_;
              auVar13._28_4_ = auVar80._28_4_;
              auVar80 = vroundps_avx(auVar13,1);
              auVar78 = vshufps_avx(ZEXT416((uint)(fVar88 + -1.0)),ZEXT416((uint)(fVar88 + -1.0)),0)
              ;
              auVar128._16_16_ = auVar78;
              auVar128._0_16_ = auVar78;
              auVar80 = vminps_avx(auVar80,auVar128);
              auVar80 = vmaxps_avx(auVar80,_DAT_02020f00);
              local_aa0 = vsubps_avx(auVar13,auVar80);
              local_ac0 = vcvtps2dq_avx(auVar80);
              local_e64 = uVar3 & 0x7fff;
              local_e68 = uVar4 & 0x7fff;
              uVar6 = *(uint *)(local_cf8 + 4 + local_d00);
              uVar63 = (ulong)uVar6;
              uVar62 = (ulong)(uVar6 * local_e68 + *(int *)(local_cf8 + local_d00) + local_e64);
              lVar8 = *(long *)&pGVar7[2].numPrimitives;
              lVar65 = (long)*(int *)(local_ac0 + sVar68 * 4) * 0x38;
              lVar9 = *(long *)(lVar8 + 0x10 + lVar65);
              lVar10 = *(long *)(lVar8 + lVar65);
              auVar78 = *(undefined1 (*) [16])(lVar10 + lVar9 * uVar62);
              lVar11 = *(long *)(lVar8 + 0x48 + lVar65);
              auVar104 = *(undefined1 (*) [16])(lVar10 + (uVar62 + 1) * lVar9);
              lVar59 = uVar62 + uVar63;
              auVar119 = *(undefined1 (*) [16])(lVar10 + lVar59 * lVar9);
              lVar73 = uVar62 + uVar63 + 1;
              auVar117 = *(undefined1 (*) [16])(lVar10 + lVar73 * lVar9);
              uVar58 = (ulong)(-1 < (short)uVar3);
              lVar55 = uVar62 + uVar58 + 1;
              auVar77 = *(undefined1 (*) [16])(lVar10 + lVar55 * lVar9);
              lVar69 = uVar58 + lVar73;
              auVar118 = *(undefined1 (*) [16])(lVar10 + lVar69 * lVar9);
              uVar58 = 0;
              if (-1 < (short)uVar4) {
                uVar58 = uVar63;
              }
              auVar120 = *(undefined1 (*) [16])(lVar10 + (lVar59 + uVar58) * lVar9);
              auVar139 = *(undefined1 (*) [16])(lVar10 + (lVar73 + uVar58) * lVar9);
              auVar140 = *(undefined1 (*) [16])(lVar10 + lVar9 * (uVar58 + lVar69));
              lVar8 = *(long *)(lVar8 + 0x38 + lVar65);
              fVar75 = *(float *)(local_aa0 + local_d88 * 4);
              auVar141 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * uVar62),auVar78);
              auVar126._0_4_ = fVar75 * auVar141._0_4_ + auVar78._0_4_;
              auVar126._4_4_ = fVar75 * auVar141._4_4_ + auVar78._4_4_;
              auVar126._8_4_ = fVar75 * auVar141._8_4_ + auVar78._8_4_;
              auVar126._12_4_ = fVar75 * auVar141._12_4_ + auVar78._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (uVar62 + 1)),auVar104);
              auVar211._0_4_ = fVar75 * auVar78._0_4_ + auVar104._0_4_;
              auVar211._4_4_ = fVar75 * auVar78._4_4_ + auVar104._4_4_;
              auVar211._8_4_ = fVar75 * auVar78._8_4_ + auVar104._8_4_;
              auVar211._12_4_ = fVar75 * auVar78._12_4_ + auVar104._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar59),auVar119);
              auVar79._0_4_ = fVar75 * auVar78._0_4_ + auVar119._0_4_;
              auVar79._4_4_ = fVar75 * auVar78._4_4_ + auVar119._4_4_;
              auVar79._8_4_ = fVar75 * auVar78._8_4_ + auVar119._8_4_;
              auVar79._12_4_ = fVar75 * auVar78._12_4_ + auVar119._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar73),auVar117);
              auVar107._0_4_ = fVar75 * auVar78._0_4_ + auVar117._0_4_;
              auVar107._4_4_ = fVar75 * auVar78._4_4_ + auVar117._4_4_;
              auVar107._8_4_ = fVar75 * auVar78._8_4_ + auVar117._8_4_;
              auVar107._12_4_ = fVar75 * auVar78._12_4_ + auVar117._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar55),auVar77);
              auVar158._0_4_ = fVar75 * auVar78._0_4_ + auVar77._0_4_;
              auVar158._4_4_ = fVar75 * auVar78._4_4_ + auVar77._4_4_;
              auVar158._8_4_ = fVar75 * auVar78._8_4_ + auVar77._8_4_;
              auVar158._12_4_ = fVar75 * auVar78._12_4_ + auVar77._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * lVar69),auVar118);
              auVar171._0_4_ = fVar75 * auVar78._0_4_ + auVar118._0_4_;
              auVar171._4_4_ = fVar75 * auVar78._4_4_ + auVar118._4_4_;
              auVar171._8_4_ = fVar75 * auVar78._8_4_ + auVar118._8_4_;
              auVar171._12_4_ = fVar75 * auVar78._12_4_ + auVar118._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar59 + uVar58)),
                                   auVar120);
              auVar147._0_4_ = auVar120._0_4_ + fVar75 * auVar78._0_4_;
              auVar147._4_4_ = auVar120._4_4_ + fVar75 * auVar78._4_4_;
              auVar147._8_4_ = auVar120._8_4_ + fVar75 * auVar78._8_4_;
              auVar147._12_4_ = auVar120._12_4_ + fVar75 * auVar78._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + lVar11 * (lVar73 + uVar58)),
                                   auVar139);
              auVar185._0_4_ = auVar139._0_4_ + fVar75 * auVar78._0_4_;
              auVar185._4_4_ = auVar139._4_4_ + fVar75 * auVar78._4_4_;
              auVar185._8_4_ = auVar139._8_4_ + fVar75 * auVar78._8_4_;
              auVar185._12_4_ = auVar139._12_4_ + fVar75 * auVar78._12_4_;
              auVar78 = vsubps_avx(*(undefined1 (*) [16])(lVar8 + (uVar58 + lVar69) * lVar11),
                                   auVar140);
              auVar198._0_4_ = auVar140._0_4_ + fVar75 * auVar78._0_4_;
              auVar198._4_4_ = auVar140._4_4_ + fVar75 * auVar78._4_4_;
              auVar198._8_4_ = auVar140._8_4_ + fVar75 * auVar78._8_4_;
              auVar198._12_4_ = auVar140._12_4_ + fVar75 * auVar78._12_4_;
              auVar117 = vunpcklps_avx(auVar126,auVar107);
              auVar78 = vunpckhps_avx(auVar126,auVar107);
              auVar77 = vunpcklps_avx(auVar211,auVar79);
              auVar104 = vunpckhps_avx(auVar211,auVar79);
              auVar119 = vunpcklps_avx(auVar78,auVar104);
              auVar120 = vunpcklps_avx(auVar117,auVar77);
              auVar78 = vunpckhps_avx(auVar117,auVar77);
              auVar77 = vunpcklps_avx(auVar211,auVar171);
              auVar104 = vunpckhps_avx(auVar211,auVar171);
              auVar118 = vunpcklps_avx(auVar158,auVar107);
              auVar117 = vunpckhps_avx(auVar158,auVar107);
              auVar139 = vunpcklps_avx(auVar104,auVar117);
              auVar140 = vunpcklps_avx(auVar77,auVar118);
              auVar104 = vunpckhps_avx(auVar77,auVar118);
              auVar118 = vunpcklps_avx(auVar107,auVar198);
              auVar117 = vunpckhps_avx(auVar107,auVar198);
              auVar141 = vunpcklps_avx(auVar171,auVar185);
              auVar77 = vunpckhps_avx(auVar171,auVar185);
              auVar142 = vunpcklps_avx(auVar117,auVar77);
              auVar150 = vunpcklps_avx(auVar118,auVar141);
              auVar117 = vunpckhps_avx(auVar118,auVar141);
              auVar141 = vunpcklps_avx(auVar79,auVar185);
              auVar77 = vunpckhps_avx(auVar79,auVar185);
              auVar151 = vunpcklps_avx(auVar107,auVar147);
              auVar118 = vunpckhps_avx(auVar107,auVar147);
              auVar118 = vunpcklps_avx(auVar77,auVar118);
              auVar105 = vunpcklps_avx(auVar141,auVar151);
              auVar77 = vunpckhps_avx(auVar141,auVar151);
              auVar186._16_16_ = auVar150;
              auVar186._0_16_ = auVar120;
              auVar199._16_16_ = auVar117;
              auVar199._0_16_ = auVar78;
              auVar129._16_16_ = auVar142;
              auVar129._0_16_ = auVar119;
              auVar204._16_16_ = auVar140;
              auVar204._0_16_ = auVar140;
              auVar212._16_16_ = auVar104;
              auVar212._0_16_ = auVar104;
              auVar160._16_16_ = auVar139;
              auVar160._0_16_ = auVar139;
              auVar221._16_16_ = auVar105;
              auVar221._0_16_ = auVar105;
              auVar108._16_16_ = auVar77;
              auVar108._0_16_ = auVar77;
              auVar83._16_16_ = auVar118;
              auVar83._0_16_ = auVar118;
              local_a20 = &local_eb1;
              uVar60 = *(undefined4 *)(local_d10 + local_d88 * 4);
              auVar224._4_4_ = uVar60;
              auVar224._0_4_ = uVar60;
              auVar224._8_4_ = uVar60;
              auVar224._12_4_ = uVar60;
              auVar224._16_4_ = uVar60;
              auVar224._20_4_ = uVar60;
              auVar224._24_4_ = uVar60;
              auVar224._28_4_ = uVar60;
              uVar60 = *(undefined4 *)(local_d10 + local_d88 * 4 + 0x20);
              auVar235._4_4_ = uVar60;
              auVar235._0_4_ = uVar60;
              auVar235._8_4_ = uVar60;
              auVar235._12_4_ = uVar60;
              auVar235._16_4_ = uVar60;
              auVar235._20_4_ = uVar60;
              auVar235._24_4_ = uVar60;
              auVar235._28_4_ = uVar60;
              uVar60 = *(undefined4 *)(local_d10 + local_d88 * 4 + 0x40);
              auVar255._4_4_ = uVar60;
              auVar255._0_4_ = uVar60;
              auVar255._8_4_ = uVar60;
              auVar255._12_4_ = uVar60;
              auVar255._16_4_ = uVar60;
              auVar255._20_4_ = uVar60;
              auVar255._24_4_ = uVar60;
              auVar255._28_4_ = uVar60;
              local_c80 = vsubps_avx(auVar186,auVar224);
              local_ca0 = vsubps_avx(auVar199,auVar235);
              auVar81 = vsubps_avx(auVar129,auVar255);
              auVar80 = vsubps_avx(auVar204,auVar224);
              auVar127 = vsubps_avx(auVar212,auVar235);
              auVar13 = vsubps_avx(auVar160,auVar255);
              auVar82 = vsubps_avx(auVar221,auVar224);
              auVar128 = vsubps_avx(auVar108,auVar235);
              auVar14 = vsubps_avx(auVar83,auVar255);
              auVar15 = vsubps_avx(auVar82,local_c80);
              auVar16 = vsubps_avx(auVar128,local_ca0);
              auVar83 = vsubps_avx(auVar14,auVar81);
              fVar88 = local_ca0._0_4_;
              fVar75 = auVar128._0_4_ + fVar88;
              fVar93 = local_ca0._4_4_;
              fVar87 = auVar128._4_4_ + fVar93;
              fVar99 = local_ca0._8_4_;
              fVar89 = auVar128._8_4_ + fVar99;
              fVar134 = local_ca0._12_4_;
              fVar91 = auVar128._12_4_ + fVar134;
              fVar136 = local_ca0._16_4_;
              fVar94 = auVar128._16_4_ + fVar136;
              fVar138 = local_ca0._20_4_;
              fVar97 = auVar128._20_4_ + fVar138;
              fVar115 = local_ca0._24_4_;
              fVar100 = auVar128._24_4_ + fVar115;
              fVar76 = local_ca0._28_4_;
              fVar257 = auVar81._0_4_;
              fVar177 = fVar257 + auVar14._0_4_;
              fVar260 = auVar81._4_4_;
              fVar188 = fVar260 + auVar14._4_4_;
              fVar262 = auVar81._8_4_;
              fVar189 = fVar262 + auVar14._8_4_;
              fVar264 = auVar81._12_4_;
              fVar190 = fVar264 + auVar14._12_4_;
              fVar266 = auVar81._16_4_;
              fVar191 = fVar266 + auVar14._16_4_;
              fVar268 = auVar81._20_4_;
              fVar192 = fVar268 + auVar14._20_4_;
              fVar270 = auVar81._24_4_;
              fVar193 = fVar270 + auVar14._24_4_;
              fVar163 = auVar81._28_4_;
              fVar92 = auVar83._0_4_;
              fVar95 = auVar83._4_4_;
              auVar17._4_4_ = fVar87 * fVar95;
              auVar17._0_4_ = fVar75 * fVar92;
              fVar98 = auVar83._8_4_;
              auVar17._8_4_ = fVar89 * fVar98;
              fVar101 = auVar83._12_4_;
              auVar17._12_4_ = fVar91 * fVar101;
              fVar103 = auVar83._16_4_;
              auVar17._16_4_ = fVar94 * fVar103;
              fVar112 = auVar83._20_4_;
              auVar17._20_4_ = fVar97 * fVar112;
              fVar113 = auVar83._24_4_;
              auVar17._24_4_ = fVar100 * fVar113;
              auVar17._28_4_ = auVar104._12_4_;
              fVar232 = auVar16._0_4_;
              fVar237 = auVar16._4_4_;
              auVar18._4_4_ = fVar237 * fVar188;
              auVar18._0_4_ = fVar232 * fVar177;
              fVar240 = auVar16._8_4_;
              auVar18._8_4_ = fVar240 * fVar189;
              fVar243 = auVar16._12_4_;
              auVar18._12_4_ = fVar243 * fVar190;
              fVar246 = auVar16._16_4_;
              auVar18._16_4_ = fVar246 * fVar191;
              fVar249 = auVar16._20_4_;
              auVar18._20_4_ = fVar249 * fVar192;
              fVar252 = auVar16._24_4_;
              auVar18._24_4_ = fVar252 * fVar193;
              auVar18._28_4_ = auVar105._12_4_;
              auVar16 = vsubps_avx(auVar18,auVar17);
              fVar90 = local_c80._0_4_;
              fVar207 = auVar82._0_4_ + fVar90;
              fVar96 = local_c80._4_4_;
              fVar215 = auVar82._4_4_ + fVar96;
              fVar102 = local_c80._8_4_;
              fVar216 = auVar82._8_4_ + fVar102;
              fVar135 = local_c80._12_4_;
              fVar217 = auVar82._12_4_ + fVar135;
              fVar137 = local_c80._16_4_;
              fVar218 = auVar82._16_4_ + fVar137;
              fVar114 = local_c80._20_4_;
              fVar219 = auVar82._20_4_ + fVar114;
              fVar116 = local_c80._24_4_;
              fVar220 = auVar82._24_4_ + fVar116;
              fVar223 = auVar15._0_4_;
              fVar226 = auVar15._4_4_;
              auVar19._4_4_ = fVar226 * fVar188;
              auVar19._0_4_ = fVar223 * fVar177;
              fVar227 = auVar15._8_4_;
              auVar19._8_4_ = fVar227 * fVar189;
              fVar228 = auVar15._12_4_;
              auVar19._12_4_ = fVar228 * fVar190;
              fVar229 = auVar15._16_4_;
              auVar19._16_4_ = fVar229 * fVar191;
              fVar230 = auVar15._20_4_;
              auVar19._20_4_ = fVar230 * fVar192;
              fVar231 = auVar15._24_4_;
              auVar19._24_4_ = fVar231 * fVar193;
              auVar19._28_4_ = fVar163 + auVar14._28_4_;
              auVar15._4_4_ = fVar215 * fVar95;
              auVar15._0_4_ = fVar207 * fVar92;
              auVar15._8_4_ = fVar216 * fVar98;
              auVar15._12_4_ = fVar217 * fVar101;
              auVar15._16_4_ = fVar218 * fVar103;
              auVar15._20_4_ = fVar219 * fVar112;
              auVar15._24_4_ = fVar220 * fVar113;
              auVar15._28_4_ = auVar105._12_4_;
              auVar15 = vsubps_avx(auVar15,auVar19);
              auVar20._4_4_ = fVar215 * fVar237;
              auVar20._0_4_ = fVar207 * fVar232;
              auVar20._8_4_ = fVar216 * fVar240;
              auVar20._12_4_ = fVar217 * fVar243;
              auVar20._16_4_ = fVar218 * fVar246;
              auVar20._20_4_ = fVar219 * fVar249;
              auVar20._24_4_ = fVar220 * fVar252;
              auVar20._28_4_ = auVar82._28_4_ + local_c80._28_4_;
              auVar21._4_4_ = fVar226 * fVar87;
              auVar21._0_4_ = fVar223 * fVar75;
              auVar21._8_4_ = fVar227 * fVar89;
              auVar21._12_4_ = fVar228 * fVar91;
              auVar21._16_4_ = fVar229 * fVar94;
              auVar21._20_4_ = fVar230 * fVar97;
              auVar21._24_4_ = fVar231 * fVar100;
              auVar21._28_4_ = auVar128._28_4_ + fVar76;
              auVar17 = vsubps_avx(auVar21,auVar20);
              local_b20 = *(float *)(local_d10 + local_d88 * 4 + 0xa0);
              fVar75 = *(float *)(local_d10 + local_d88 * 4 + 0xc0);
              auVar130._4_4_ = fVar75;
              auVar130._0_4_ = fVar75;
              auVar130._8_4_ = fVar75;
              auVar130._12_4_ = fVar75;
              auVar130._16_4_ = fVar75;
              auVar130._20_4_ = fVar75;
              auVar130._24_4_ = fVar75;
              auVar130._28_4_ = fVar75;
              local_e60._4_4_ = *(float *)(local_d10 + local_d88 * 4 + 0x80);
              local_b40._0_4_ =
                   local_e60._4_4_ * auVar16._0_4_ +
                   auVar17._0_4_ * fVar75 + local_b20 * auVar15._0_4_;
              local_b40._4_4_ =
                   local_e60._4_4_ * auVar16._4_4_ +
                   auVar17._4_4_ * fVar75 + local_b20 * auVar15._4_4_;
              local_b40._8_4_ =
                   local_e60._4_4_ * auVar16._8_4_ +
                   auVar17._8_4_ * fVar75 + local_b20 * auVar15._8_4_;
              local_b40._12_4_ =
                   local_e60._4_4_ * auVar16._12_4_ +
                   auVar17._12_4_ * fVar75 + local_b20 * auVar15._12_4_;
              local_b40._16_4_ =
                   local_e60._4_4_ * auVar16._16_4_ +
                   auVar17._16_4_ * fVar75 + local_b20 * auVar15._16_4_;
              local_b40._20_4_ =
                   local_e60._4_4_ * auVar16._20_4_ +
                   auVar17._20_4_ * fVar75 + local_b20 * auVar15._20_4_;
              local_b40._24_4_ =
                   local_e60._4_4_ * auVar16._24_4_ +
                   auVar17._24_4_ * fVar75 + local_b20 * auVar15._24_4_;
              local_b40._28_4_ = auVar15._28_4_ + auVar17._28_4_ + auVar15._28_4_;
              local_ae0 = vsubps_avx(local_ca0,auVar127);
              local_b00 = vsubps_avx(auVar81,auVar13);
              fVar91 = fVar88 + auVar127._0_4_;
              fVar94 = fVar93 + auVar127._4_4_;
              fVar97 = fVar99 + auVar127._8_4_;
              fVar100 = fVar134 + auVar127._12_4_;
              fVar177 = fVar136 + auVar127._16_4_;
              fVar188 = fVar138 + auVar127._20_4_;
              fVar189 = fVar115 + auVar127._24_4_;
              fVar87 = auVar127._28_4_;
              fVar190 = fVar257 + auVar13._0_4_;
              fVar191 = fVar260 + auVar13._4_4_;
              fVar192 = fVar262 + auVar13._8_4_;
              fVar193 = fVar264 + auVar13._12_4_;
              fVar207 = fVar266 + auVar13._16_4_;
              fVar215 = fVar268 + auVar13._20_4_;
              fVar216 = fVar270 + auVar13._24_4_;
              fVar89 = auVar13._28_4_;
              fVar233 = local_b00._0_4_;
              fVar238 = local_b00._4_4_;
              auVar16._4_4_ = fVar238 * fVar94;
              auVar16._0_4_ = fVar233 * fVar91;
              fVar241 = local_b00._8_4_;
              auVar16._8_4_ = fVar241 * fVar97;
              fVar244 = local_b00._12_4_;
              auVar16._12_4_ = fVar244 * fVar100;
              fVar247 = local_b00._16_4_;
              auVar16._16_4_ = fVar247 * fVar177;
              fVar250 = local_b00._20_4_;
              auVar16._20_4_ = fVar250 * fVar188;
              fVar253 = local_b00._24_4_;
              auVar16._24_4_ = fVar253 * fVar189;
              auVar16._28_4_ = fVar163;
              fVar272 = local_ae0._0_4_;
              fVar275 = local_ae0._4_4_;
              auVar22._4_4_ = fVar275 * fVar191;
              auVar22._0_4_ = fVar272 * fVar190;
              fVar277 = local_ae0._8_4_;
              auVar22._8_4_ = fVar277 * fVar192;
              fVar279 = local_ae0._12_4_;
              auVar22._12_4_ = fVar279 * fVar193;
              fVar281 = local_ae0._16_4_;
              auVar22._16_4_ = fVar281 * fVar207;
              fVar283 = local_ae0._20_4_;
              auVar22._20_4_ = fVar283 * fVar215;
              fVar285 = local_ae0._24_4_;
              auVar22._24_4_ = fVar285 * fVar216;
              auVar22._28_4_ = fVar76;
              auVar15 = vsubps_avx(auVar22,auVar16);
              auVar16 = vsubps_avx(local_c80,auVar80);
              fVar258 = auVar16._0_4_;
              fVar261 = auVar16._4_4_;
              auVar23._4_4_ = fVar261 * fVar191;
              auVar23._0_4_ = fVar258 * fVar190;
              fVar263 = auVar16._8_4_;
              auVar23._8_4_ = fVar263 * fVar192;
              fVar265 = auVar16._12_4_;
              auVar23._12_4_ = fVar265 * fVar193;
              fVar267 = auVar16._16_4_;
              auVar23._16_4_ = fVar267 * fVar207;
              fVar269 = auVar16._20_4_;
              auVar23._20_4_ = fVar269 * fVar215;
              fVar271 = auVar16._24_4_;
              auVar23._24_4_ = fVar271 * fVar216;
              auVar23._28_4_ = fVar163 + fVar89;
              fVar190 = fVar90 + auVar80._0_4_;
              fVar191 = fVar96 + auVar80._4_4_;
              fVar192 = fVar102 + auVar80._8_4_;
              fVar193 = fVar135 + auVar80._12_4_;
              fVar207 = fVar137 + auVar80._16_4_;
              fVar215 = fVar114 + auVar80._20_4_;
              fVar216 = fVar116 + auVar80._24_4_;
              auVar24._4_4_ = fVar191 * fVar238;
              auVar24._0_4_ = fVar190 * fVar233;
              auVar24._8_4_ = fVar192 * fVar241;
              auVar24._12_4_ = fVar193 * fVar244;
              auVar24._16_4_ = fVar207 * fVar247;
              auVar24._20_4_ = fVar215 * fVar250;
              auVar24._24_4_ = fVar216 * fVar253;
              auVar24._28_4_ = local_b00._28_4_;
              auVar16 = vsubps_avx(auVar24,auVar23);
              auVar25._4_4_ = fVar191 * fVar275;
              auVar25._0_4_ = fVar190 * fVar272;
              auVar25._8_4_ = fVar192 * fVar277;
              auVar25._12_4_ = fVar193 * fVar279;
              auVar25._16_4_ = fVar207 * fVar281;
              auVar25._20_4_ = fVar215 * fVar283;
              auVar25._24_4_ = fVar216 * fVar285;
              auVar25._28_4_ = local_c80._28_4_ + auVar80._28_4_;
              auVar26._4_4_ = fVar261 * fVar94;
              auVar26._0_4_ = fVar258 * fVar91;
              auVar26._8_4_ = fVar263 * fVar97;
              auVar26._12_4_ = fVar265 * fVar100;
              auVar26._16_4_ = fVar267 * fVar177;
              auVar26._20_4_ = fVar269 * fVar188;
              auVar26._24_4_ = fVar271 * fVar189;
              auVar26._28_4_ = fVar76 + fVar87;
              auVar17 = vsubps_avx(auVar26,auVar25);
              local_b60._0_4_ =
                   local_e60._4_4_ * auVar15._0_4_ +
                   auVar17._0_4_ * fVar75 + local_b20 * auVar16._0_4_;
              local_b60._4_4_ =
                   local_e60._4_4_ * auVar15._4_4_ +
                   auVar17._4_4_ * fVar75 + local_b20 * auVar16._4_4_;
              local_b60._8_4_ =
                   local_e60._4_4_ * auVar15._8_4_ +
                   auVar17._8_4_ * fVar75 + local_b20 * auVar16._8_4_;
              local_b60._12_4_ =
                   local_e60._4_4_ * auVar15._12_4_ +
                   auVar17._12_4_ * fVar75 + local_b20 * auVar16._12_4_;
              local_b60._16_4_ =
                   local_e60._4_4_ * auVar15._16_4_ +
                   auVar17._16_4_ * fVar75 + local_b20 * auVar16._16_4_;
              local_b60._20_4_ =
                   local_e60._4_4_ * auVar15._20_4_ +
                   auVar17._20_4_ * fVar75 + local_b20 * auVar16._20_4_;
              local_b60._24_4_ =
                   local_e60._4_4_ * auVar15._24_4_ +
                   auVar17._24_4_ * fVar75 + local_b20 * auVar16._24_4_;
              local_b60._28_4_ = auVar15._28_4_ + auVar17._28_4_ + auVar16._28_4_;
              auVar16 = vsubps_avx(auVar80,auVar82);
              fVar218 = auVar80._0_4_ + auVar82._0_4_;
              fVar219 = auVar80._4_4_ + auVar82._4_4_;
              fVar220 = auVar80._8_4_ + auVar82._8_4_;
              fVar163 = auVar80._12_4_ + auVar82._12_4_;
              fVar164 = auVar80._16_4_ + auVar82._16_4_;
              fVar165 = auVar80._20_4_ + auVar82._20_4_;
              fVar166 = auVar80._24_4_ + auVar82._24_4_;
              auVar17 = vsubps_avx(auVar127,auVar128);
              fVar191 = auVar127._0_4_ + auVar128._0_4_;
              fVar192 = auVar127._4_4_ + auVar128._4_4_;
              fVar193 = auVar127._8_4_ + auVar128._8_4_;
              fVar207 = auVar127._12_4_ + auVar128._12_4_;
              fVar215 = auVar127._16_4_ + auVar128._16_4_;
              fVar216 = auVar127._20_4_ + auVar128._20_4_;
              fVar217 = auVar127._24_4_ + auVar128._24_4_;
              auVar18 = vsubps_avx(auVar13,auVar14);
              fVar94 = auVar13._0_4_ + auVar14._0_4_;
              fVar97 = auVar13._4_4_ + auVar14._4_4_;
              fVar100 = auVar13._8_4_ + auVar14._8_4_;
              fVar177 = auVar13._12_4_ + auVar14._12_4_;
              fVar188 = auVar13._16_4_ + auVar14._16_4_;
              fVar189 = auVar13._20_4_ + auVar14._20_4_;
              fVar190 = auVar13._24_4_ + auVar14._24_4_;
              fVar234 = auVar18._0_4_;
              fVar239 = auVar18._4_4_;
              auVar27._4_4_ = fVar239 * fVar192;
              auVar27._0_4_ = fVar234 * fVar191;
              fVar242 = auVar18._8_4_;
              auVar27._8_4_ = fVar242 * fVar193;
              fVar245 = auVar18._12_4_;
              auVar27._12_4_ = fVar245 * fVar207;
              fVar248 = auVar18._16_4_;
              auVar27._16_4_ = fVar248 * fVar215;
              fVar251 = auVar18._20_4_;
              auVar27._20_4_ = fVar251 * fVar216;
              fVar254 = auVar18._24_4_;
              auVar27._24_4_ = fVar254 * fVar217;
              auVar27._28_4_ = auVar15._28_4_;
              fVar273 = auVar17._0_4_;
              fVar276 = auVar17._4_4_;
              auVar28._4_4_ = fVar276 * fVar97;
              auVar28._0_4_ = fVar273 * fVar94;
              fVar278 = auVar17._8_4_;
              auVar28._8_4_ = fVar278 * fVar100;
              fVar280 = auVar17._12_4_;
              auVar28._12_4_ = fVar280 * fVar177;
              fVar282 = auVar17._16_4_;
              auVar28._16_4_ = fVar282 * fVar188;
              fVar284 = auVar17._20_4_;
              auVar28._20_4_ = fVar284 * fVar189;
              fVar286 = auVar17._24_4_;
              auVar28._24_4_ = fVar286 * fVar190;
              auVar28._28_4_ = fVar89;
              auVar127 = vsubps_avx(auVar28,auVar27);
              fVar76 = auVar16._0_4_;
              fVar91 = auVar16._4_4_;
              auVar29._4_4_ = fVar91 * fVar97;
              auVar29._0_4_ = fVar76 * fVar94;
              fVar94 = auVar16._8_4_;
              auVar29._8_4_ = fVar94 * fVar100;
              fVar97 = auVar16._12_4_;
              auVar29._12_4_ = fVar97 * fVar177;
              fVar100 = auVar16._16_4_;
              auVar29._16_4_ = fVar100 * fVar188;
              fVar177 = auVar16._20_4_;
              auVar29._20_4_ = fVar177 * fVar189;
              fVar188 = auVar16._24_4_;
              auVar29._24_4_ = fVar188 * fVar190;
              auVar29._28_4_ = fVar89 + auVar14._28_4_;
              auVar14._4_4_ = fVar239 * fVar219;
              auVar14._0_4_ = fVar234 * fVar218;
              auVar14._8_4_ = fVar242 * fVar220;
              auVar14._12_4_ = fVar245 * fVar163;
              auVar14._16_4_ = fVar248 * fVar164;
              auVar14._20_4_ = fVar251 * fVar165;
              auVar14._24_4_ = fVar254 * fVar166;
              auVar14._28_4_ = fVar89;
              auVar13 = vsubps_avx(auVar14,auVar29);
              auVar30._4_4_ = fVar276 * fVar219;
              auVar30._0_4_ = fVar273 * fVar218;
              auVar30._8_4_ = fVar278 * fVar220;
              auVar30._12_4_ = fVar280 * fVar163;
              auVar30._16_4_ = fVar282 * fVar164;
              auVar30._20_4_ = fVar284 * fVar165;
              auVar30._24_4_ = fVar286 * fVar166;
              auVar30._28_4_ = auVar80._28_4_ + auVar82._28_4_;
              auVar31._4_4_ = fVar91 * fVar192;
              auVar31._0_4_ = fVar76 * fVar191;
              auVar31._8_4_ = fVar94 * fVar193;
              auVar31._12_4_ = fVar97 * fVar207;
              auVar31._16_4_ = fVar100 * fVar215;
              auVar31._20_4_ = fVar177 * fVar216;
              auVar31._24_4_ = fVar188 * fVar217;
              auVar31._28_4_ = fVar87 + auVar128._28_4_;
              auVar80 = vsubps_avx(auVar31,auVar30);
              local_e60._0_4_ = local_e60._4_4_;
              fStack_e58 = local_e60._4_4_;
              fStack_e54 = local_e60._4_4_;
              fStack_e50 = local_e60._4_4_;
              fStack_e4c = local_e60._4_4_;
              fStack_e48 = local_e60._4_4_;
              fStack_e44 = local_e60._4_4_;
              auVar109._0_4_ =
                   local_e60._4_4_ * auVar127._0_4_ +
                   auVar80._0_4_ * fVar75 + local_b20 * auVar13._0_4_;
              auVar109._4_4_ =
                   local_e60._4_4_ * auVar127._4_4_ +
                   auVar80._4_4_ * fVar75 + local_b20 * auVar13._4_4_;
              auVar109._8_4_ =
                   local_e60._4_4_ * auVar127._8_4_ +
                   auVar80._8_4_ * fVar75 + local_b20 * auVar13._8_4_;
              auVar109._12_4_ =
                   local_e60._4_4_ * auVar127._12_4_ +
                   auVar80._12_4_ * fVar75 + local_b20 * auVar13._12_4_;
              auVar109._16_4_ =
                   local_e60._4_4_ * auVar127._16_4_ +
                   auVar80._16_4_ * fVar75 + local_b20 * auVar13._16_4_;
              auVar109._20_4_ =
                   local_e60._4_4_ * auVar127._20_4_ +
                   auVar80._20_4_ * fVar75 + local_b20 * auVar13._20_4_;
              auVar109._24_4_ =
                   local_e60._4_4_ * auVar127._24_4_ +
                   auVar80._24_4_ * fVar75 + local_b20 * auVar13._24_4_;
              auVar109._28_4_ = auVar80._28_4_ + auVar80._28_4_ + auVar13._28_4_;
              local_a40._0_4_ = auVar109._0_4_ + local_b40._0_4_ + local_b60._0_4_;
              local_a40._4_4_ = auVar109._4_4_ + local_b40._4_4_ + local_b60._4_4_;
              local_a40._8_4_ = auVar109._8_4_ + local_b40._8_4_ + local_b60._8_4_;
              local_a40._12_4_ = auVar109._12_4_ + local_b40._12_4_ + local_b60._12_4_;
              local_a40._16_4_ = auVar109._16_4_ + local_b40._16_4_ + local_b60._16_4_;
              local_a40._20_4_ = auVar109._20_4_ + local_b40._20_4_ + local_b60._20_4_;
              local_a40._24_4_ = auVar109._24_4_ + local_b40._24_4_ + local_b60._24_4_;
              local_a40._28_4_ = auVar109._28_4_ + local_b40._28_4_ + local_b60._28_4_;
              auVar80 = vminps_avx(local_b40,local_b60);
              auVar80 = vminps_avx(auVar80,auVar109);
              auVar161._8_4_ = 0x7fffffff;
              auVar161._0_8_ = 0x7fffffff7fffffff;
              auVar161._12_4_ = 0x7fffffff;
              auVar161._16_4_ = 0x7fffffff;
              auVar161._20_4_ = 0x7fffffff;
              auVar161._24_4_ = 0x7fffffff;
              auVar161._28_4_ = 0x7fffffff;
              local_bc0 = vandps_avx(local_a40,auVar161);
              fVar89 = local_bc0._0_4_ * 1.1920929e-07;
              fVar189 = local_bc0._4_4_ * 1.1920929e-07;
              auVar32._4_4_ = fVar189;
              auVar32._0_4_ = fVar89;
              fVar190 = local_bc0._8_4_ * 1.1920929e-07;
              auVar32._8_4_ = fVar190;
              fVar191 = local_bc0._12_4_ * 1.1920929e-07;
              auVar32._12_4_ = fVar191;
              fVar192 = local_bc0._16_4_ * 1.1920929e-07;
              auVar32._16_4_ = fVar192;
              fVar193 = local_bc0._20_4_ * 1.1920929e-07;
              auVar32._20_4_ = fVar193;
              fVar207 = local_bc0._24_4_ * 1.1920929e-07;
              auVar32._24_4_ = fVar207;
              auVar32._28_4_ = 0x34000000;
              auVar173._0_8_ = CONCAT44(fVar189,fVar89) ^ 0x8000000080000000;
              auVar173._8_4_ = -fVar190;
              auVar173._12_4_ = -fVar191;
              auVar173._16_4_ = -fVar192;
              auVar173._20_4_ = -fVar193;
              auVar173._24_4_ = -fVar207;
              auVar173._28_4_ = 0xb4000000;
              auVar80 = vcmpps_avx(auVar80,auVar173,5);
              auVar13 = vmaxps_avx(local_b40,local_b60);
              auVar127 = vmaxps_avx(auVar13,auVar109);
              auVar127 = vcmpps_avx(auVar127,auVar32,2);
              auVar80 = vorps_avx(auVar80,auVar127);
              uVar58 = local_eb0;
              uVar62 = local_e80;
              uVar63 = local_e88;
              uVar64 = local_e90;
              uVar66 = local_e98;
              uVar67 = local_ea0;
              if ((((((((auVar80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar80 >> 0x7f,0) == '\0') &&
                    (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar80 >> 0xbf,0) == '\0') &&
                  (auVar80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar80[0x1f]) {
LAB_004082c6:
                auVar236 = ZEXT1664(local_dc0);
                auVar256 = ZEXT1664(local_dd0);
                auVar259 = ZEXT1664(local_de0);
                auVar274 = ZEXT1664(local_df0);
                auVar214 = ZEXT1664(local_e00);
                auVar187 = ZEXT1664(local_e10);
                auVar222 = ZEXT1664(local_e20);
                auVar225 = ZEXT1664(local_e30);
                auVar201 = ZEXT1664(local_e40);
                auVar176 = ZEXT1664(local_da0);
                auVar206 = ZEXT1664(local_db0);
              }
              else {
                uStack_be8._4_4_ = auVar83._28_4_;
                auVar33._4_4_ = fVar275 * fVar95;
                auVar33._0_4_ = fVar272 * fVar92;
                auVar33._8_4_ = fVar277 * fVar98;
                auVar33._12_4_ = fVar279 * fVar101;
                auVar33._16_4_ = fVar281 * fVar103;
                auVar33._20_4_ = fVar283 * fVar112;
                auVar33._24_4_ = fVar285 * fVar113;
                auVar33._28_4_ = auVar127._28_4_;
                auVar34._4_4_ = fVar237 * fVar238;
                auVar34._0_4_ = fVar232 * fVar233;
                auVar34._8_4_ = fVar240 * fVar241;
                auVar34._12_4_ = fVar243 * fVar244;
                auVar34._16_4_ = fVar246 * fVar247;
                auVar34._20_4_ = fVar249 * fVar250;
                auVar34._24_4_ = fVar252 * fVar253;
                auVar34._28_4_ = 0x34000000;
                auVar82 = vsubps_avx(auVar34,auVar33);
                auVar35._4_4_ = fVar238 * fVar276;
                auVar35._0_4_ = fVar233 * fVar273;
                auVar35._8_4_ = fVar241 * fVar278;
                auVar35._12_4_ = fVar244 * fVar280;
                auVar35._16_4_ = fVar247 * fVar282;
                auVar35._20_4_ = fVar250 * fVar284;
                auVar35._24_4_ = fVar253 * fVar286;
                auVar35._28_4_ = auVar13._28_4_;
                auVar36._4_4_ = fVar275 * fVar239;
                auVar36._0_4_ = fVar272 * fVar234;
                auVar36._8_4_ = fVar277 * fVar242;
                auVar36._12_4_ = fVar279 * fVar245;
                auVar36._16_4_ = fVar281 * fVar248;
                auVar36._20_4_ = fVar283 * fVar251;
                auVar36._24_4_ = fVar285 * fVar254;
                auVar36._28_4_ = local_b20;
                auVar14 = vsubps_avx(auVar36,auVar35);
                auVar213._8_4_ = 0x7fffffff;
                auVar213._0_8_ = 0x7fffffff7fffffff;
                auVar213._12_4_ = 0x7fffffff;
                auVar213._16_4_ = 0x7fffffff;
                auVar213._20_4_ = 0x7fffffff;
                auVar213._24_4_ = 0x7fffffff;
                auVar213._28_4_ = 0x7fffffff;
                auVar127 = vandps_avx(auVar213,auVar33);
                auVar13 = vandps_avx(auVar213,auVar35);
                auVar127 = vcmpps_avx(auVar127,auVar13,1);
                auVar128 = vblendvps_avx(auVar14,auVar82,auVar127);
                auVar37._4_4_ = fVar261 * fVar239;
                auVar37._0_4_ = fVar258 * fVar234;
                auVar37._8_4_ = fVar263 * fVar242;
                auVar37._12_4_ = fVar265 * fVar245;
                auVar37._16_4_ = fVar267 * fVar248;
                auVar37._20_4_ = fVar269 * fVar251;
                auVar37._24_4_ = fVar271 * fVar254;
                auVar37._28_4_ = auVar82._28_4_;
                auVar38._4_4_ = fVar261 * fVar95;
                auVar38._0_4_ = fVar258 * fVar92;
                auVar38._8_4_ = fVar263 * fVar98;
                auVar38._12_4_ = fVar265 * fVar101;
                auVar38._16_4_ = fVar267 * fVar103;
                auVar38._20_4_ = fVar269 * fVar112;
                auVar38._24_4_ = fVar271 * fVar113;
                auVar38._28_4_ = auVar13._28_4_;
                auVar39._4_4_ = fVar226 * fVar238;
                auVar39._0_4_ = fVar223 * fVar233;
                auVar39._8_4_ = fVar227 * fVar241;
                auVar39._12_4_ = fVar228 * fVar244;
                auVar39._16_4_ = fVar229 * fVar247;
                auVar39._20_4_ = fVar230 * fVar250;
                auVar39._24_4_ = fVar231 * fVar253;
                auVar39._28_4_ = fVar87;
                auVar82 = vsubps_avx(auVar38,auVar39);
                auVar40._4_4_ = fVar238 * fVar91;
                auVar40._0_4_ = fVar233 * fVar76;
                auVar40._8_4_ = fVar241 * fVar94;
                auVar40._12_4_ = fVar244 * fVar97;
                auVar40._16_4_ = fVar247 * fVar100;
                auVar40._20_4_ = fVar250 * fVar177;
                auVar40._24_4_ = fVar253 * fVar188;
                auVar40._28_4_ = auVar14._28_4_;
                auVar14 = vsubps_avx(auVar40,auVar37);
                auVar127 = vandps_avx(auVar213,auVar39);
                auVar13 = vandps_avx(auVar213,auVar37);
                auVar13 = vcmpps_avx(auVar127,auVar13,1);
                auVar14 = vblendvps_avx(auVar14,auVar82,auVar13);
                auVar41._4_4_ = fVar275 * fVar91;
                auVar41._0_4_ = fVar272 * fVar76;
                auVar41._8_4_ = fVar277 * fVar94;
                auVar41._12_4_ = fVar279 * fVar97;
                auVar41._16_4_ = fVar281 * fVar100;
                auVar41._20_4_ = fVar283 * fVar177;
                auVar41._24_4_ = fVar285 * fVar188;
                auVar41._28_4_ = auVar16._28_4_;
                auVar42._4_4_ = fVar226 * fVar275;
                auVar42._0_4_ = fVar223 * fVar272;
                auVar42._8_4_ = fVar227 * fVar277;
                auVar42._12_4_ = fVar228 * fVar279;
                auVar42._16_4_ = fVar229 * fVar281;
                auVar42._20_4_ = fVar230 * fVar283;
                auVar42._24_4_ = fVar231 * fVar285;
                auVar42._28_4_ = auVar13._28_4_;
                auVar43._4_4_ = fVar261 * fVar237;
                auVar43._0_4_ = fVar258 * fVar232;
                auVar43._8_4_ = fVar263 * fVar240;
                auVar43._12_4_ = fVar265 * fVar243;
                auVar43._16_4_ = fVar267 * fVar246;
                auVar43._20_4_ = fVar269 * fVar249;
                auVar43._24_4_ = fVar271 * fVar252;
                auVar43._28_4_ = auVar82._28_4_;
                auVar44._4_4_ = fVar261 * fVar276;
                auVar44._0_4_ = fVar258 * fVar273;
                auVar44._8_4_ = fVar263 * fVar278;
                auVar44._12_4_ = fVar265 * fVar280;
                auVar44._16_4_ = fVar267 * fVar282;
                auVar44._20_4_ = fVar269 * fVar284;
                auVar44._24_4_ = fVar271 * fVar286;
                auVar44._28_4_ = uStack_be8._4_4_;
                auVar15 = vsubps_avx(auVar42,auVar43);
                auVar16 = vsubps_avx(auVar44,auVar41);
                auVar13 = vandps_avx(auVar213,auVar43);
                auVar82 = vandps_avx(auVar213,auVar41);
                auVar82 = vcmpps_avx(auVar13,auVar82,1);
                auVar82 = vblendvps_avx(auVar16,auVar15,auVar82);
                auVar78 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                fVar76 = auVar82._0_4_;
                fVar87 = auVar82._4_4_;
                fVar89 = auVar82._8_4_;
                fVar92 = auVar82._12_4_;
                fVar95 = auVar82._16_4_;
                fVar98 = auVar82._20_4_;
                fVar101 = auVar82._24_4_;
                fVar207 = auVar14._0_4_;
                fVar215 = auVar14._4_4_;
                fVar216 = auVar14._8_4_;
                fVar217 = auVar14._12_4_;
                fVar218 = auVar14._16_4_;
                fVar219 = auVar14._20_4_;
                fVar220 = auVar14._24_4_;
                fVar103 = auVar128._0_4_;
                fVar112 = auVar128._4_4_;
                fVar113 = auVar128._8_4_;
                fVar91 = auVar128._12_4_;
                fVar94 = auVar128._16_4_;
                fVar97 = auVar128._20_4_;
                fVar100 = auVar128._24_4_;
                fVar177 = fVar103 * local_e60._4_4_ + fVar76 * fVar75 + fVar207 * local_b20;
                fVar188 = fVar112 * local_e60._4_4_ + fVar87 * fVar75 + fVar215 * local_b20;
                fVar189 = fVar113 * local_e60._4_4_ + fVar89 * fVar75 + fVar216 * local_b20;
                fVar190 = fVar91 * local_e60._4_4_ + fVar92 * fVar75 + fVar217 * local_b20;
                fVar191 = fVar94 * local_e60._4_4_ + fVar95 * fVar75 + fVar218 * local_b20;
                fVar192 = fVar97 * local_e60._4_4_ + fVar98 * fVar75 + fVar219 * local_b20;
                fVar75 = fVar100 * local_e60._4_4_ + fVar101 * fVar75 + fVar220 * local_b20;
                fVar193 = auVar17._28_4_ + auVar17._28_4_ + 0.0;
                auVar148._0_4_ = fVar177 + fVar177;
                auVar148._4_4_ = fVar188 + fVar188;
                auVar148._8_4_ = fVar189 + fVar189;
                auVar148._12_4_ = fVar190 + fVar190;
                auVar148._16_4_ = fVar191 + fVar191;
                auVar148._20_4_ = fVar192 + fVar192;
                auVar148._24_4_ = fVar75 + fVar75;
                auVar148._28_4_ = fVar193 + fVar193;
                fVar177 = fVar103 * fVar90 + fVar76 * fVar257 + fVar207 * fVar88;
                fVar188 = fVar112 * fVar96 + fVar87 * fVar260 + fVar215 * fVar93;
                fVar189 = fVar113 * fVar102 + fVar89 * fVar262 + fVar216 * fVar99;
                fVar134 = fVar91 * fVar135 + fVar92 * fVar264 + fVar217 * fVar134;
                fVar135 = fVar94 * fVar137 + fVar95 * fVar266 + fVar218 * fVar136;
                fVar136 = fVar97 * fVar114 + fVar98 * fVar268 + fVar219 * fVar138;
                fVar137 = fVar100 * fVar116 + fVar101 * fVar270 + fVar220 * fVar115;
                fVar138 = auVar13._28_4_ + fVar193 + auVar13._28_4_;
                auVar80 = vrcpps_avx(auVar148);
                fVar75 = auVar80._0_4_;
                fVar88 = auVar80._4_4_;
                auVar45._4_4_ = auVar148._4_4_ * fVar88;
                auVar45._0_4_ = auVar148._0_4_ * fVar75;
                fVar90 = auVar80._8_4_;
                auVar45._8_4_ = auVar148._8_4_ * fVar90;
                fVar93 = auVar80._12_4_;
                auVar45._12_4_ = auVar148._12_4_ * fVar93;
                fVar96 = auVar80._16_4_;
                auVar45._16_4_ = auVar148._16_4_ * fVar96;
                fVar99 = auVar80._20_4_;
                auVar45._20_4_ = auVar148._20_4_ * fVar99;
                fVar102 = auVar80._24_4_;
                auVar45._24_4_ = auVar148._24_4_ * fVar102;
                auVar45._28_4_ = auVar127._28_4_;
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = &DAT_3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar80 = vsubps_avx(auVar205,auVar45);
                local_9a0._4_4_ = (fVar188 + fVar188) * (fVar88 + fVar88 * auVar80._4_4_);
                local_9a0._0_4_ = (fVar177 + fVar177) * (fVar75 + fVar75 * auVar80._0_4_);
                local_9a0._8_4_ = (fVar189 + fVar189) * (fVar90 + fVar90 * auVar80._8_4_);
                local_9a0._12_4_ = (fVar134 + fVar134) * (fVar93 + fVar93 * auVar80._12_4_);
                local_9a0._16_4_ = (fVar135 + fVar135) * (fVar96 + fVar96 * auVar80._16_4_);
                local_9a0._20_4_ = (fVar136 + fVar136) * (fVar99 + fVar99 * auVar80._20_4_);
                local_9a0._24_4_ = (fVar137 + fVar137) * (fVar102 + fVar102 * auVar80._24_4_);
                local_9a0._28_4_ = fVar138 + fVar138;
                uVar60 = *(undefined4 *)(local_d10 + local_d88 * 4 + 0x60);
                auVar174._4_4_ = uVar60;
                auVar174._0_4_ = uVar60;
                auVar174._8_4_ = uVar60;
                auVar174._12_4_ = uVar60;
                auVar174._16_4_ = uVar60;
                auVar174._20_4_ = uVar60;
                auVar174._24_4_ = uVar60;
                auVar174._28_4_ = uVar60;
                auVar80 = vcmpps_avx(auVar174,local_9a0,2);
                uVar60 = *(undefined4 *)(local_d10 + local_d88 * 4 + 0x100);
                auVar200._4_4_ = uVar60;
                auVar200._0_4_ = uVar60;
                auVar200._8_4_ = uVar60;
                auVar200._12_4_ = uVar60;
                auVar200._16_4_ = uVar60;
                auVar200._20_4_ = uVar60;
                auVar200._24_4_ = uVar60;
                auVar200._28_4_ = uVar60;
                auVar127 = vcmpps_avx(local_9a0,auVar200,2);
                auVar80 = vandps_avx(auVar127,auVar80);
                auVar104 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                auVar78 = vpand_avx(auVar104,auVar78);
                auVar104 = vpmovsxwd_avx(auVar78);
                auVar117 = vpshufd_avx(auVar78,0xee);
                auVar117 = vpmovsxwd_avx(auVar117);
                auVar175._16_16_ = auVar117;
                auVar175._0_16_ = auVar104;
                if ((((((((auVar175 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar175 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar175 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar175 >> 0x7f,0) == '\0') &&
                      (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar117 >> 0x3f,0) == '\0') &&
                    (auVar175 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar117[0xf]) goto LAB_004082c6;
                auVar80 = vcmpps_avx(auVar148,_DAT_02020f00,4);
                auVar104 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                auVar78 = vpand_avx(auVar78,auVar104);
                auVar104 = vpmovsxwd_avx(auVar78);
                auVar78 = vpunpckhwd_avx(auVar78,auVar78);
                local_a00._16_16_ = auVar78;
                local_a00._0_16_ = auVar104;
                if ((((((((local_a00 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_a00 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_a00 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_a00 >> 0x7f,0) == '\0') &&
                      (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar78 >> 0x3f,0) == '\0') &&
                    (local_a00 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar78[0xf]) goto LAB_004082c6;
                local_a20 = &local_eb1;
                auVar80 = vsubps_avx(local_a40,local_b60);
                auVar80 = vblendvps_avx(local_b40,auVar80,local_b80);
                auVar127 = vsubps_avx(local_a40,local_b40);
                auVar127 = vblendvps_avx(local_b60,auVar127,local_b80);
                local_980[0] = (float)local_ba0._0_4_ * fVar103;
                local_980[1] = (float)local_ba0._4_4_ * fVar112;
                local_980[2] = fStack_b98 * fVar113;
                local_980[3] = fStack_b94 * fVar91;
                fStack_970 = fStack_b90 * fVar94;
                fStack_96c = fStack_b8c * fVar97;
                fStack_968 = fStack_b88 * fVar100;
                uStack_964 = auVar128._28_4_;
                local_960[0] = fVar207 * (float)local_ba0._0_4_;
                local_960[1] = fVar215 * (float)local_ba0._4_4_;
                local_960[2] = fVar216 * fStack_b98;
                local_960[3] = fVar217 * fStack_b94;
                fStack_950 = fVar218 * fStack_b90;
                fStack_94c = fVar219 * fStack_b8c;
                fStack_948 = fVar220 * fStack_b88;
                uStack_944 = auVar128._28_4_;
                local_940[0] = (float)local_ba0._0_4_ * fVar76;
                local_940[1] = (float)local_ba0._4_4_ * fVar87;
                local_940[2] = fStack_b98 * fVar89;
                local_940[3] = fStack_b94 * fVar92;
                fStack_930 = fStack_b90 * fVar95;
                fStack_92c = fStack_b8c * fVar98;
                fStack_928 = fStack_b88 * fVar101;
                uStack_924 = auVar82._28_4_;
                auVar78 = vpshufd_avx(ZEXT416(local_e64),0);
                auVar78 = vpaddd_avx(auVar78,_DAT_0201c990);
                auVar159._0_4_ = (float)(int)(*(ushort *)(local_cf8 + 8 + local_d00) - 1);
                auVar159._4_12_ = auVar18._4_12_;
                auVar104 = vpshufd_avx(ZEXT416(local_e68),0);
                auVar104 = vpaddd_avx(auVar104,_DAT_0201c9a0);
                auVar117 = vrcpss_avx(auVar159,auVar159);
                auVar172._0_4_ = (float)(int)(*(ushort *)(local_cf8 + 10 + local_d00) - 1);
                auVar172._4_12_ = auVar18._4_12_;
                auVar77 = vrcpss_avx(auVar172,auVar172);
                auVar84._16_16_ = auVar78;
                auVar84._0_16_ = auVar78;
                auVar13 = vcvtdq2ps_avx(auVar84);
                fVar134 = auVar13._28_4_ + auVar80._28_4_;
                auVar78 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - auVar117._0_4_ * auVar159._0_4_)));
                auVar78 = vshufps_avx(auVar78,auVar78,0);
                fVar75 = (local_a40._0_4_ * auVar13._0_4_ + auVar80._0_4_) * auVar78._0_4_;
                fVar88 = (local_a40._4_4_ * auVar13._4_4_ + auVar80._4_4_) * auVar78._4_4_;
                local_a80._4_4_ = fVar88;
                local_a80._0_4_ = fVar75;
                fVar90 = (local_a40._8_4_ * auVar13._8_4_ + auVar80._8_4_) * auVar78._8_4_;
                local_a80._8_4_ = fVar90;
                fVar93 = (local_a40._12_4_ * auVar13._12_4_ + auVar80._12_4_) * auVar78._12_4_;
                local_a80._12_4_ = fVar93;
                fVar96 = (local_a40._16_4_ * auVar13._16_4_ + auVar80._16_4_) * auVar78._0_4_;
                local_a80._16_4_ = fVar96;
                fVar99 = (local_a40._20_4_ * auVar13._20_4_ + auVar80._20_4_) * auVar78._4_4_;
                local_a80._20_4_ = fVar99;
                fVar102 = (local_a40._24_4_ * auVar13._24_4_ + auVar80._24_4_) * auVar78._8_4_;
                local_a80._24_4_ = fVar102;
                local_a80._28_4_ = fVar134;
                auVar110._16_16_ = auVar104;
                auVar110._0_16_ = auVar104;
                auVar80 = vcvtdq2ps_avx(auVar110);
                auVar104 = ZEXT416((uint)(auVar77._0_4_ * (2.0 - auVar77._0_4_ * auVar172._0_4_)));
                auVar104 = vshufps_avx(auVar104,auVar104,0);
                fVar135 = (local_a40._0_4_ * auVar80._0_4_ + auVar127._0_4_) * auVar104._0_4_;
                fVar136 = (local_a40._4_4_ * auVar80._4_4_ + auVar127._4_4_) * auVar104._4_4_;
                local_a60._4_4_ = fVar136;
                local_a60._0_4_ = fVar135;
                fVar137 = (local_a40._8_4_ * auVar80._8_4_ + auVar127._8_4_) * auVar104._8_4_;
                local_a60._8_4_ = fVar137;
                fVar138 = (local_a40._12_4_ * auVar80._12_4_ + auVar127._12_4_) * auVar104._12_4_;
                local_a60._12_4_ = fVar138;
                fVar114 = (local_a40._16_4_ * auVar80._16_4_ + auVar127._16_4_) * auVar104._0_4_;
                local_a60._16_4_ = fVar114;
                fVar115 = (local_a40._20_4_ * auVar80._20_4_ + auVar127._20_4_) * auVar104._4_4_;
                local_a60._20_4_ = fVar115;
                fVar116 = (local_a40._24_4_ * auVar80._24_4_ + auVar127._24_4_) * auVar104._8_4_;
                local_a60._24_4_ = fVar116;
                local_a60._28_4_ = auVar80._28_4_ + auVar127._28_4_;
                local_d60 = (local_cf0->geometries).items[local_d90].ptr;
                if ((local_d60->mask & *(uint *)(local_d10 + local_d88 * 4 + 0x120)) == 0)
                goto LAB_004082c6;
                auVar176 = ZEXT1664(local_da0);
                auVar206 = ZEXT1664(local_db0);
                puVar70 = local_e78;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (local_d60->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                  auVar236 = ZEXT1664(local_dc0);
                  auVar256 = ZEXT1664(local_dd0);
                  auVar259 = ZEXT1664(local_de0);
                  auVar274 = ZEXT1664(local_df0);
                  auVar214 = ZEXT1664(local_e00);
                  auVar187 = ZEXT1664(local_e10);
                  auVar222 = ZEXT1664(local_e20);
                  auVar225 = ZEXT1664(local_e30);
                  auVar201 = ZEXT1664(local_e40);
                  goto LAB_004083ef;
                }
                auVar80 = vrcpps_avx(local_a40);
                fVar76 = auVar80._0_4_;
                fVar87 = auVar80._4_4_;
                auVar46._4_4_ = local_a40._4_4_ * fVar87;
                auVar46._0_4_ = local_a40._0_4_ * fVar76;
                fVar89 = auVar80._8_4_;
                auVar46._8_4_ = local_a40._8_4_ * fVar89;
                fVar92 = auVar80._12_4_;
                auVar46._12_4_ = local_a40._12_4_ * fVar92;
                fVar95 = auVar80._16_4_;
                auVar46._16_4_ = local_a40._16_4_ * fVar95;
                fVar98 = auVar80._20_4_;
                auVar46._20_4_ = local_a40._20_4_ * fVar98;
                fVar101 = auVar80._24_4_;
                auVar46._24_4_ = local_a40._24_4_ * fVar101;
                auVar46._28_4_ = auVar78._12_4_;
                auVar162._8_4_ = 0x3f800000;
                auVar162._0_8_ = &DAT_3f8000003f800000;
                auVar162._12_4_ = 0x3f800000;
                auVar162._16_4_ = 0x3f800000;
                auVar162._20_4_ = 0x3f800000;
                auVar162._24_4_ = 0x3f800000;
                auVar162._28_4_ = 0x3f800000;
                auVar127 = vsubps_avx(auVar162,auVar46);
                auVar131._0_4_ = fVar76 + fVar76 * auVar127._0_4_;
                auVar131._4_4_ = fVar87 + fVar87 * auVar127._4_4_;
                auVar131._8_4_ = fVar89 + fVar89 * auVar127._8_4_;
                auVar131._12_4_ = fVar92 + fVar92 * auVar127._12_4_;
                auVar131._16_4_ = fVar95 + fVar95 * auVar127._16_4_;
                auVar131._20_4_ = fVar98 + fVar98 * auVar127._20_4_;
                auVar131._24_4_ = fVar101 + fVar101 * auVar127._24_4_;
                auVar131._28_4_ = auVar80._28_4_ + auVar127._28_4_;
                auVar149._8_4_ = 0x219392ef;
                auVar149._0_8_ = 0x219392ef219392ef;
                auVar149._12_4_ = 0x219392ef;
                auVar149._16_4_ = 0x219392ef;
                auVar149._20_4_ = 0x219392ef;
                auVar149._24_4_ = 0x219392ef;
                auVar149._28_4_ = 0x219392ef;
                auVar80 = vcmpps_avx(local_bc0,auVar149,5);
                auVar80 = vandps_avx(auVar80,auVar131);
                auVar47._4_4_ = fVar88 * auVar80._4_4_;
                auVar47._0_4_ = fVar75 * auVar80._0_4_;
                auVar47._8_4_ = fVar90 * auVar80._8_4_;
                auVar47._12_4_ = fVar93 * auVar80._12_4_;
                auVar47._16_4_ = fVar96 * auVar80._16_4_;
                auVar47._20_4_ = fVar99 * auVar80._20_4_;
                auVar47._24_4_ = fVar102 * auVar80._24_4_;
                auVar47._28_4_ = fVar134;
                local_9e0 = vminps_avx(auVar47,auVar162);
                auVar48._4_4_ = fVar136 * auVar80._4_4_;
                auVar48._0_4_ = fVar135 * auVar80._0_4_;
                auVar48._8_4_ = fVar137 * auVar80._8_4_;
                auVar48._12_4_ = fVar138 * auVar80._12_4_;
                auVar48._16_4_ = fVar114 * auVar80._16_4_;
                auVar48._20_4_ = fVar115 * auVar80._20_4_;
                auVar48._24_4_ = fVar116 * auVar80._24_4_;
                auVar48._28_4_ = local_9e0._28_4_;
                local_9c0 = vminps_avx(auVar48,auVar162);
                iVar53 = vmovmskps_avx(local_a00);
                uVar54 = CONCAT44((int)((ulong)context->args >> 0x20),iVar53);
                local_e60 = uVar54;
                local_d80 = 0;
                if (uVar54 != 0) {
                  for (; (uVar54 >> local_d80 & 1) == 0; local_d80 = local_d80 + 1) {
                  }
                }
                auStack_d78 = local_a40._8_24_;
                local_ce0._1_31_ = auVar81._1_31_;
                local_ce0[0] = iVar53 != 0;
                auVar236 = ZEXT1664(local_dc0);
                auVar256 = ZEXT1664(local_dd0);
                auVar259 = ZEXT1664(local_de0);
                auVar274 = ZEXT1664(local_df0);
                auVar214 = ZEXT1664(local_e00);
                auVar187 = ZEXT1664(local_e10);
                auVar222 = ZEXT1664(local_e20);
                auVar225 = ZEXT1664(local_e30);
                auVar201 = ZEXT1664(local_e40);
                if (iVar53 != 0) {
                  auStack_d58 = auVar130._8_24_;
                  auVar78 = vshufps_avx(ZEXT416(uVar57),ZEXT416(uVar57),0);
                  local_cc0._16_16_ = auVar78;
                  local_cc0._0_16_ = auVar78;
                  auVar78 = vshufps_avx(ZEXT416(uVar5),ZEXT416(uVar5),0);
                  local_be0._16_16_ = auVar78;
                  local_be0._0_16_ = auVar78;
                  uStack_bf0 = *local_d30;
                  local_c00 = *local_d28;
                  uStack_be8 = local_d30[1];
                  fStack_b1c = local_b20;
                  fStack_b18 = local_b20;
                  fStack_b14 = local_b20;
                  fStack_b10 = local_b20;
                  fStack_b0c = local_b20;
                  fStack_b08 = local_b20;
                  fStack_b04 = local_b20;
                  do {
                    puVar70 = local_e78;
                    local_ca0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                    local_8c0 = *(undefined4 *)(local_9e0 + local_d80 * 4);
                    local_8a0 = *(undefined4 *)(local_9c0 + local_d80 * 4);
                    *(undefined4 *)(ray + k * 4 + 0x100) =
                         *(undefined4 *)(local_9a0 + local_d80 * 4);
                    fVar75 = local_980[local_d80];
                    auVar132._4_4_ = fVar75;
                    auVar132._0_4_ = fVar75;
                    auVar132._8_4_ = fVar75;
                    auVar132._12_4_ = fVar75;
                    auVar132._16_4_ = fVar75;
                    auVar132._20_4_ = fVar75;
                    auVar132._24_4_ = fVar75;
                    auVar132._28_4_ = fVar75;
                    fVar88 = local_960[local_d80];
                    local_900._4_4_ = fVar88;
                    local_900._0_4_ = fVar88;
                    local_900._8_4_ = fVar88;
                    local_900._12_4_ = fVar88;
                    local_900._16_4_ = fVar88;
                    local_900._20_4_ = fVar88;
                    local_900._24_4_ = fVar88;
                    local_900._28_4_ = fVar88;
                    fVar88 = local_940[local_d80];
                    local_8e0._4_4_ = fVar88;
                    local_8e0._0_4_ = fVar88;
                    local_8e0._8_4_ = fVar88;
                    local_8e0._12_4_ = fVar88;
                    local_8e0._16_4_ = fVar88;
                    local_8e0._20_4_ = fVar88;
                    local_8e0._24_4_ = fVar88;
                    local_8e0._28_4_ = fVar88;
                    local_c30.context = context->user;
                    local_920[0] = (RTCHitN)SUB41(fVar75,0);
                    local_920[1] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[2] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[3] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[4] = (RTCHitN)SUB41(fVar75,0);
                    local_920[5] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[6] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[7] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[8] = (RTCHitN)SUB41(fVar75,0);
                    local_920[9] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[10] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0xb] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[0xc] = (RTCHitN)SUB41(fVar75,0);
                    local_920[0xd] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[0xe] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0xf] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[0x10] = (RTCHitN)SUB41(fVar75,0);
                    local_920[0x11] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[0x12] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0x13] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[0x14] = (RTCHitN)SUB41(fVar75,0);
                    local_920[0x15] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[0x16] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0x17] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[0x18] = (RTCHitN)SUB41(fVar75,0);
                    local_920[0x19] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[0x1a] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0x1b] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    local_920[0x1c] = (RTCHitN)SUB41(fVar75,0);
                    local_920[0x1d] = (RTCHitN)(char)((uint)fVar75 >> 8);
                    local_920[0x1e] = (RTCHitN)(char)((uint)fVar75 >> 0x10);
                    local_920[0x1f] = (RTCHitN)(char)((uint)fVar75 >> 0x18);
                    uStack_8bc = local_8c0;
                    uStack_8b8 = local_8c0;
                    uStack_8b4 = local_8c0;
                    uStack_8b0 = local_8c0;
                    uStack_8ac = local_8c0;
                    uStack_8a8 = local_8c0;
                    uStack_8a4 = local_8c0;
                    uStack_89c = local_8a0;
                    uStack_898 = local_8a0;
                    uStack_894 = local_8a0;
                    uStack_890 = local_8a0;
                    uStack_88c = local_8a0;
                    uStack_888 = local_8a0;
                    uStack_884 = local_8a0;
                    local_880 = local_be0._0_8_;
                    uStack_878 = local_be0._8_8_;
                    uStack_870 = local_be0._16_8_;
                    uStack_868 = local_be0._24_8_;
                    local_860 = local_cc0._0_8_;
                    uStack_858 = local_cc0._8_8_;
                    uStack_850 = local_cc0._16_8_;
                    uStack_848 = local_cc0._24_8_;
                    auVar80 = vcmpps_avx(auVar132,auVar132,0xf);
                    local_c80._0_8_ = local_c30.context;
                    uStack_83c = (local_c30.context)->instID[0];
                    local_840 = uStack_83c;
                    uStack_838 = uStack_83c;
                    uStack_834 = uStack_83c;
                    uStack_830 = uStack_83c;
                    uStack_82c = uStack_83c;
                    uStack_828 = uStack_83c;
                    uStack_824 = uStack_83c;
                    uStack_81c = (local_c30.context)->instPrimID[0];
                    local_820 = uStack_81c;
                    uStack_818 = uStack_81c;
                    uStack_814 = uStack_81c;
                    uStack_810 = uStack_81c;
                    uStack_80c = uStack_81c;
                    uStack_808 = uStack_81c;
                    uStack_804 = uStack_81c;
                    local_c60 = local_c00._0_8_;
                    uStack_c58 = local_c00._8_8_;
                    uStack_c50 = uStack_bf0;
                    uStack_c48 = uStack_be8;
                    local_c30.valid = (int *)&local_c60;
                    local_c30.geometryUserPtr = *(void **)((long)local_d60 + 0x18);
                    local_c30.ray = (RTCRayN *)ray;
                    local_c30.hit = local_920;
                    local_c30.N = 8;
                    if (*(code **)((long)local_d60 + 0x48) != (code *)0x0) {
                      auVar80 = ZEXT1632(auVar80._0_16_);
                      (**(code **)((long)local_d60 + 0x48))(&local_c30);
                      auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                      auVar206 = ZEXT1664(local_db0);
                      auVar176 = ZEXT1664(local_da0);
                      auVar201 = ZEXT1664(local_e40);
                      auVar225 = ZEXT1664(local_e30);
                      auVar222 = ZEXT1664(local_e20);
                      auVar187 = ZEXT1664(local_e10);
                      auVar214 = ZEXT1664(local_e00);
                      auVar274 = ZEXT1664(local_df0);
                      auVar259 = ZEXT1664(local_de0);
                      auVar256 = ZEXT1664(local_dd0);
                      auVar236 = ZEXT1664(local_dc0);
                      uVar58 = local_eb0;
                      uVar62 = local_e80;
                      uVar63 = local_e88;
                      uVar64 = local_e90;
                      uVar66 = local_e98;
                      uVar67 = local_ea0;
                    }
                    auVar49._8_8_ = uStack_c58;
                    auVar49._0_8_ = local_c60;
                    auVar78 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar49);
                    auVar51._8_8_ = uStack_c48;
                    auVar51._0_8_ = uStack_c50;
                    auVar104 = vpcmpeqd_avx(ZEXT816(0) << 0x40,auVar51);
                    auVar85._16_16_ = auVar104;
                    auVar85._0_16_ = auVar78;
                    auVar127 = auVar80 & ~auVar85;
                    if ((((((((auVar127 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar127 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar127 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar127 >> 0x7f,0) == '\0') &&
                          (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar127 >> 0xbf,0) == '\0') &&
                        (auVar127 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar127[0x1f]) {
                      auVar86._0_4_ = auVar78._0_4_ ^ auVar80._0_4_;
                      auVar86._4_4_ = auVar78._4_4_ ^ auVar80._4_4_;
                      auVar86._8_4_ = auVar78._8_4_ ^ auVar80._8_4_;
                      auVar86._12_4_ = auVar78._12_4_ ^ auVar80._12_4_;
                      auVar86._16_4_ = auVar104._0_4_ ^ auVar80._16_4_;
                      auVar86._20_4_ = auVar104._4_4_ ^ auVar80._20_4_;
                      auVar86._24_4_ = auVar104._8_4_ ^ auVar80._24_4_;
                      auVar86._28_4_ = auVar104._12_4_ ^ auVar80._28_4_;
                    }
                    else {
                      p_Var12 = context->args->filter;
                      if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          ((*(byte *)((long)local_d60 + 0x3e) & 0x40) != 0)))) {
                        auVar80 = ZEXT1632(auVar80._0_16_);
                        (*p_Var12)(&local_c30);
                        auVar80 = vcmpps_avx(auVar80,auVar80,0xf);
                        auVar206 = ZEXT1664(local_db0);
                        auVar176 = ZEXT1664(local_da0);
                        auVar201 = ZEXT1664(local_e40);
                        auVar225 = ZEXT1664(local_e30);
                        auVar222 = ZEXT1664(local_e20);
                        auVar187 = ZEXT1664(local_e10);
                        auVar214 = ZEXT1664(local_e00);
                        auVar274 = ZEXT1664(local_df0);
                        auVar259 = ZEXT1664(local_de0);
                        auVar256 = ZEXT1664(local_dd0);
                        auVar236 = ZEXT1664(local_dc0);
                        uVar58 = local_eb0;
                        uVar62 = local_e80;
                        uVar63 = local_e88;
                        uVar64 = local_e90;
                        uVar66 = local_e98;
                        uVar67 = local_ea0;
                      }
                      auVar50._8_8_ = uStack_c58;
                      auVar50._0_8_ = local_c60;
                      auVar78 = vpcmpeqd_avx((undefined1  [16])0x0,auVar50);
                      auVar52._8_8_ = uStack_c48;
                      auVar52._0_8_ = uStack_c50;
                      auVar104 = vpcmpeqd_avx((undefined1  [16])0x0,auVar52);
                      auVar111._16_16_ = auVar104;
                      auVar111._0_16_ = auVar78;
                      auVar86._0_4_ = auVar78._0_4_ ^ auVar80._0_4_;
                      auVar86._4_4_ = auVar78._4_4_ ^ auVar80._4_4_;
                      auVar86._8_4_ = auVar78._8_4_ ^ auVar80._8_4_;
                      auVar86._12_4_ = auVar78._12_4_ ^ auVar80._12_4_;
                      auVar86._16_4_ = auVar104._0_4_ ^ auVar80._16_4_;
                      auVar86._20_4_ = auVar104._4_4_ ^ auVar80._20_4_;
                      auVar86._24_4_ = auVar104._8_4_ ^ auVar80._24_4_;
                      auVar86._28_4_ = auVar104._12_4_ ^ auVar80._28_4_;
                      auVar133._8_4_ = 0xff800000;
                      auVar133._0_8_ = 0xff800000ff800000;
                      auVar133._12_4_ = 0xff800000;
                      auVar133._16_4_ = 0xff800000;
                      auVar133._20_4_ = 0xff800000;
                      auVar133._24_4_ = 0xff800000;
                      auVar133._28_4_ = 0xff800000;
                      auVar80 = vblendvps_avx(auVar133,*(undefined1 (*) [32])(local_c30.ray + 0x100)
                                              ,auVar111);
                      *(undefined1 (*) [32])(local_c30.ray + 0x100) = auVar80;
                    }
                    if ((((((((auVar86 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar86 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar86 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar86 >> 0x7f,0) != '\0') ||
                          (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar86 >> 0xbf,0) != '\0') ||
                        (auVar86 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar86[0x1f] < '\0') break;
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_ca0._0_4_;
                    local_e60 = local_e60 ^ 1L << (local_d80 & 0x3f);
                    local_d80 = 0;
                    if (local_e60 != 0) {
                      for (; (local_e60 >> local_d80 & 1) == 0; local_d80 = local_d80 + 1) {
                      }
                    }
                    local_ce0[0] = local_e60 != 0;
                    puVar70 = local_e78;
                  } while (local_e60 != 0);
                }
                if ((local_ce0 & (undefined1  [32])0x1) != (undefined1  [32])0x0) goto LAB_004083ef;
              }
              local_e70 = local_e70 & local_e70 - 1;
              sVar68 = k;
              pRVar72 = ray;
            } while (local_e70 != 0);
          }
          local_d08 = local_d08 + 1;
          bVar74 = local_d08 < local_ea8;
          puVar70 = local_e78;
        } while (local_d08 != local_ea8);
      }
LAB_004083ef:
      uVar57 = 0;
      if (bVar74) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar57 = 1;
      }
    }
  } while ((uVar57 & 3) == 0);
  return local_ce8 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }